

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [16];
  undefined4 uVar5;
  undefined8 uVar6;
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  byte bVar70;
  uint uVar71;
  long lVar72;
  uint uVar73;
  float fVar113;
  vint4 bi_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar114;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar89 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar115;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar119;
  float fVar154;
  float fVar155;
  vint4 bi;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar120;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar132 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar205;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar191 [16];
  float fVar207;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar208;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar209;
  undefined1 auVar204 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar235;
  float fVar238;
  vint4 ai_2;
  undefined1 auVar213 [16];
  float fVar241;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar236;
  float fVar239;
  float fVar242;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar237;
  float fVar240;
  float fVar243;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar244;
  float fVar257;
  float fVar258;
  undefined1 auVar245 [16];
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar260;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [16];
  vint4 ai;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  float fVar286;
  float fVar287;
  float fVar304;
  float fVar306;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar305;
  float fVar307;
  float fVar308;
  undefined1 auVar303 [32];
  float fVar309;
  float fVar317;
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar315 [32];
  float fVar319;
  undefined1 auVar316 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar339;
  float fVar347;
  float fVar348;
  vfloat4 a0;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar349;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar359;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar368;
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCFilterFunctionNArguments local_4e0;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  uint auStack_470 [4];
  undefined1 local_460 [16];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar272 [32];
  undefined1 auVar364 [32];
  
  PVar7 = prim[1];
  uVar67 = (ulong)(byte)PVar7;
  lVar68 = uVar67 * 0x25;
  fVar119 = *(float *)(prim + lVar68 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar217 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar217 = vinsertps_avx(auVar217,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar93 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar121._0_4_ = fVar119 * auVar93._0_4_;
  auVar121._4_4_ = fVar119 * auVar93._4_4_;
  auVar121._8_4_ = fVar119 * auVar93._8_4_;
  auVar121._12_4_ = fVar119 * auVar93._12_4_;
  auVar274._0_4_ = fVar119 * auVar217._0_4_;
  auVar274._4_4_ = fVar119 * auVar217._4_4_;
  auVar274._8_4_ = fVar119 * auVar217._8_4_;
  auVar274._12_4_ = fVar119 * auVar217._12_4_;
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar294 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar294 = vcvtdq2ps_avx(auVar294);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar67 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar172 = vshufps_avx(auVar274,auVar274,0);
  auVar135 = vshufps_avx(auVar274,auVar274,0x55);
  auVar273 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar119 = auVar273._0_4_;
  fVar120 = auVar273._4_4_;
  fVar154 = auVar273._8_4_;
  fVar155 = auVar273._12_4_;
  fVar210 = auVar135._0_4_;
  fVar235 = auVar135._4_4_;
  fVar238 = auVar135._8_4_;
  fVar241 = auVar135._12_4_;
  fVar190 = auVar172._0_4_;
  fVar205 = auVar172._4_4_;
  fVar206 = auVar172._8_4_;
  fVar207 = auVar172._12_4_;
  auVar340._0_4_ = fVar190 * auVar93._0_4_ + fVar210 * auVar217._0_4_ + fVar119 * auVar186._0_4_;
  auVar340._4_4_ = fVar205 * auVar93._4_4_ + fVar235 * auVar217._4_4_ + fVar120 * auVar186._4_4_;
  auVar340._8_4_ = fVar206 * auVar93._8_4_ + fVar238 * auVar217._8_4_ + fVar154 * auVar186._8_4_;
  auVar340._12_4_ = fVar207 * auVar93._12_4_ + fVar241 * auVar217._12_4_ + fVar155 * auVar186._12_4_
  ;
  auVar354._0_4_ = fVar190 * auVar294._0_4_ + fVar210 * auVar15._0_4_ + auVar16._0_4_ * fVar119;
  auVar354._4_4_ = fVar205 * auVar294._4_4_ + fVar235 * auVar15._4_4_ + auVar16._4_4_ * fVar120;
  auVar354._8_4_ = fVar206 * auVar294._8_4_ + fVar238 * auVar15._8_4_ + auVar16._8_4_ * fVar154;
  auVar354._12_4_ = fVar207 * auVar294._12_4_ + fVar241 * auVar15._12_4_ + auVar16._12_4_ * fVar155;
  auVar275._0_4_ = fVar190 * auVar17._0_4_ + fVar210 * auVar146._0_4_ + auVar134._0_4_ * fVar119;
  auVar275._4_4_ = fVar205 * auVar17._4_4_ + fVar235 * auVar146._4_4_ + auVar134._4_4_ * fVar120;
  auVar275._8_4_ = fVar206 * auVar17._8_4_ + fVar238 * auVar146._8_4_ + auVar134._8_4_ * fVar154;
  auVar275._12_4_ = fVar207 * auVar17._12_4_ + fVar241 * auVar146._12_4_ + auVar134._12_4_ * fVar155
  ;
  auVar172 = vshufps_avx(auVar121,auVar121,0);
  auVar135 = vshufps_avx(auVar121,auVar121,0x55);
  auVar273 = vshufps_avx(auVar121,auVar121,0xaa);
  fVar119 = auVar273._0_4_;
  fVar120 = auVar273._4_4_;
  fVar154 = auVar273._8_4_;
  fVar155 = auVar273._12_4_;
  fVar210 = auVar135._0_4_;
  fVar235 = auVar135._4_4_;
  fVar238 = auVar135._8_4_;
  fVar241 = auVar135._12_4_;
  fVar190 = auVar172._0_4_;
  fVar205 = auVar172._4_4_;
  fVar206 = auVar172._8_4_;
  fVar207 = auVar172._12_4_;
  auVar122._0_4_ = fVar190 * auVar93._0_4_ + fVar210 * auVar217._0_4_ + fVar119 * auVar186._0_4_;
  auVar122._4_4_ = fVar205 * auVar93._4_4_ + fVar235 * auVar217._4_4_ + fVar120 * auVar186._4_4_;
  auVar122._8_4_ = fVar206 * auVar93._8_4_ + fVar238 * auVar217._8_4_ + fVar154 * auVar186._8_4_;
  auVar122._12_4_ = fVar207 * auVar93._12_4_ + fVar241 * auVar217._12_4_ + fVar155 * auVar186._12_4_
  ;
  auVar74._0_4_ = fVar190 * auVar294._0_4_ + auVar16._0_4_ * fVar119 + fVar210 * auVar15._0_4_;
  auVar74._4_4_ = fVar205 * auVar294._4_4_ + auVar16._4_4_ * fVar120 + fVar235 * auVar15._4_4_;
  auVar74._8_4_ = fVar206 * auVar294._8_4_ + auVar16._8_4_ * fVar154 + fVar238 * auVar15._8_4_;
  auVar74._12_4_ = fVar207 * auVar294._12_4_ + auVar16._12_4_ * fVar155 + fVar241 * auVar15._12_4_;
  auVar288._8_4_ = 0x7fffffff;
  auVar288._0_8_ = 0x7fffffff7fffffff;
  auVar288._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar340,auVar288);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar93 = vcmpps_avx(auVar93,auVar213,1);
  auVar217 = vblendvps_avx(auVar340,auVar213,auVar93);
  auVar93 = vandps_avx(auVar354,auVar288);
  auVar93 = vcmpps_avx(auVar93,auVar213,1);
  auVar186 = vblendvps_avx(auVar354,auVar213,auVar93);
  auVar93 = vandps_avx(auVar288,auVar275);
  auVar93 = vcmpps_avx(auVar93,auVar213,1);
  auVar93 = vblendvps_avx(auVar275,auVar213,auVar93);
  auVar156._0_4_ = fVar190 * auVar17._0_4_ + fVar210 * auVar146._0_4_ + auVar134._0_4_ * fVar119;
  auVar156._4_4_ = fVar205 * auVar17._4_4_ + fVar235 * auVar146._4_4_ + auVar134._4_4_ * fVar120;
  auVar156._8_4_ = fVar206 * auVar17._8_4_ + fVar238 * auVar146._8_4_ + auVar134._8_4_ * fVar154;
  auVar156._12_4_ = fVar207 * auVar17._12_4_ + fVar241 * auVar146._12_4_ + auVar134._12_4_ * fVar155
  ;
  auVar294 = vrcpps_avx(auVar217);
  fVar190 = auVar294._0_4_;
  auVar191._0_4_ = fVar190 * auVar217._0_4_;
  fVar205 = auVar294._4_4_;
  auVar191._4_4_ = fVar205 * auVar217._4_4_;
  fVar206 = auVar294._8_4_;
  auVar191._8_4_ = fVar206 * auVar217._8_4_;
  fVar207 = auVar294._12_4_;
  auVar191._12_4_ = fVar207 * auVar217._12_4_;
  auVar289._8_4_ = 0x3f800000;
  auVar289._0_8_ = 0x3f8000003f800000;
  auVar289._12_4_ = 0x3f800000;
  auVar217 = vsubps_avx(auVar289,auVar191);
  fVar190 = fVar190 + fVar190 * auVar217._0_4_;
  fVar205 = fVar205 + fVar205 * auVar217._4_4_;
  fVar206 = fVar206 + fVar206 * auVar217._8_4_;
  fVar207 = fVar207 + fVar207 * auVar217._12_4_;
  auVar217 = vrcpps_avx(auVar186);
  fVar210 = auVar217._0_4_;
  auVar245._0_4_ = fVar210 * auVar186._0_4_;
  fVar235 = auVar217._4_4_;
  auVar245._4_4_ = fVar235 * auVar186._4_4_;
  fVar238 = auVar217._8_4_;
  auVar245._8_4_ = fVar238 * auVar186._8_4_;
  fVar241 = auVar217._12_4_;
  auVar245._12_4_ = fVar241 * auVar186._12_4_;
  auVar217 = vsubps_avx(auVar289,auVar245);
  fVar210 = fVar210 + fVar210 * auVar217._0_4_;
  fVar235 = fVar235 + fVar235 * auVar217._4_4_;
  fVar238 = fVar238 + fVar238 * auVar217._8_4_;
  fVar241 = fVar241 + fVar241 * auVar217._12_4_;
  auVar217 = vrcpps_avx(auVar93);
  fVar244 = auVar217._0_4_;
  auVar261._0_4_ = fVar244 * auVar93._0_4_;
  fVar257 = auVar217._4_4_;
  auVar261._4_4_ = fVar257 * auVar93._4_4_;
  fVar258 = auVar217._8_4_;
  auVar261._8_4_ = fVar258 * auVar93._8_4_;
  fVar259 = auVar217._12_4_;
  auVar261._12_4_ = fVar259 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar289,auVar261);
  fVar244 = fVar244 + fVar244 * auVar93._0_4_;
  fVar257 = fVar257 + fVar257 * auVar93._4_4_;
  fVar258 = fVar258 + fVar258 * auVar93._8_4_;
  fVar259 = fVar259 + fVar259 * auVar93._12_4_;
  auVar93 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                          *(float *)(prim + lVar68 + 0x1a)));
  auVar186 = vshufps_avx(auVar93,auVar93,0);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar217 = vpmovsxwd_avx(auVar217);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar294 = vsubps_avx(auVar217,auVar93);
  fVar119 = auVar186._0_4_;
  fVar120 = auVar186._4_4_;
  fVar154 = auVar186._8_4_;
  fVar155 = auVar186._12_4_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar217 = vpmovsxwd_avx(auVar186);
  auVar276._0_4_ = auVar294._0_4_ * fVar119 + auVar93._0_4_;
  auVar276._4_4_ = auVar294._4_4_ * fVar120 + auVar93._4_4_;
  auVar276._8_4_ = auVar294._8_4_ * fVar154 + auVar93._8_4_;
  auVar276._12_4_ = auVar294._12_4_ * fVar155 + auVar93._12_4_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar186 = vpmovsxwd_avx(auVar294);
  auVar93 = vcvtdq2ps_avx(auVar217);
  auVar217 = vcvtdq2ps_avx(auVar186);
  auVar217 = vsubps_avx(auVar217,auVar93);
  auVar290._0_4_ = auVar217._0_4_ * fVar119 + auVar93._0_4_;
  auVar290._4_4_ = auVar217._4_4_ * fVar120 + auVar93._4_4_;
  auVar290._8_4_ = auVar217._8_4_ * fVar154 + auVar93._8_4_;
  auVar290._12_4_ = auVar217._12_4_ * fVar155 + auVar93._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar93 = vpmovsxwd_avx(auVar15);
  uVar69 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar69 + 6);
  auVar217 = vpmovsxwd_avx(auVar16);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar217 = vsubps_avx(auVar217,auVar93);
  auVar310._0_4_ = auVar217._0_4_ * fVar119 + auVar93._0_4_;
  auVar310._4_4_ = auVar217._4_4_ * fVar120 + auVar93._4_4_;
  auVar310._8_4_ = auVar217._8_4_ * fVar154 + auVar93._8_4_;
  auVar310._12_4_ = auVar217._12_4_ * fVar155 + auVar93._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar93 = vpmovsxwd_avx(auVar17);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar217 = vpmovsxwd_avx(auVar146);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar186 = vsubps_avx(auVar217,auVar93);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar217 = vpmovsxwd_avx(auVar134);
  auVar323._0_4_ = auVar186._0_4_ * fVar119 + auVar93._0_4_;
  auVar323._4_4_ = auVar186._4_4_ * fVar120 + auVar93._4_4_;
  auVar323._8_4_ = auVar186._8_4_ * fVar154 + auVar93._8_4_;
  auVar323._12_4_ = auVar186._12_4_ * fVar155 + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar217);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar217 = vpmovsxwd_avx(auVar172);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar217 = vsubps_avx(auVar217,auVar93);
  auVar330._0_4_ = auVar217._0_4_ * fVar119 + auVar93._0_4_;
  auVar330._4_4_ = auVar217._4_4_ * fVar120 + auVar93._4_4_;
  auVar330._8_4_ = auVar217._8_4_ * fVar154 + auVar93._8_4_;
  auVar330._12_4_ = auVar217._12_4_ * fVar155 + auVar93._12_4_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar67) + 6);
  auVar93 = vpmovsxwd_avx(auVar135);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar217 = vpmovsxwd_avx(auVar273);
  auVar217 = vcvtdq2ps_avx(auVar217);
  auVar217 = vsubps_avx(auVar217,auVar93);
  auVar262._0_4_ = auVar93._0_4_ + auVar217._0_4_ * fVar119;
  auVar262._4_4_ = auVar93._4_4_ + auVar217._4_4_ * fVar120;
  auVar262._8_4_ = auVar93._8_4_ + auVar217._8_4_ * fVar154;
  auVar262._12_4_ = auVar93._12_4_ + auVar217._12_4_ * fVar155;
  auVar93 = vsubps_avx(auVar276,auVar122);
  auVar277._0_4_ = fVar190 * auVar93._0_4_;
  auVar277._4_4_ = fVar205 * auVar93._4_4_;
  auVar277._8_4_ = fVar206 * auVar93._8_4_;
  auVar277._12_4_ = fVar207 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar290,auVar122);
  auVar123._0_4_ = fVar190 * auVar93._0_4_;
  auVar123._4_4_ = fVar205 * auVar93._4_4_;
  auVar123._8_4_ = fVar206 * auVar93._8_4_;
  auVar123._12_4_ = fVar207 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar310,auVar74);
  auVar192._0_4_ = fVar210 * auVar93._0_4_;
  auVar192._4_4_ = fVar235 * auVar93._4_4_;
  auVar192._8_4_ = fVar238 * auVar93._8_4_;
  auVar192._12_4_ = fVar241 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar323,auVar74);
  auVar75._0_4_ = fVar210 * auVar93._0_4_;
  auVar75._4_4_ = fVar235 * auVar93._4_4_;
  auVar75._8_4_ = fVar238 * auVar93._8_4_;
  auVar75._12_4_ = fVar241 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar330,auVar156);
  auVar214._0_4_ = fVar244 * auVar93._0_4_;
  auVar214._4_4_ = fVar257 * auVar93._4_4_;
  auVar214._8_4_ = fVar258 * auVar93._8_4_;
  auVar214._12_4_ = fVar259 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar262,auVar156);
  auVar157._0_4_ = fVar244 * auVar93._0_4_;
  auVar157._4_4_ = fVar257 * auVar93._4_4_;
  auVar157._8_4_ = fVar258 * auVar93._8_4_;
  auVar157._12_4_ = fVar259 * auVar93._12_4_;
  auVar93 = vpminsd_avx(auVar277,auVar123);
  auVar217 = vpminsd_avx(auVar192,auVar75);
  auVar93 = vmaxps_avx(auVar93,auVar217);
  auVar217 = vpminsd_avx(auVar214,auVar157);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar291._4_4_ = uVar5;
  auVar291._0_4_ = uVar5;
  auVar291._8_4_ = uVar5;
  auVar291._12_4_ = uVar5;
  auVar217 = vmaxps_avx(auVar217,auVar291);
  auVar93 = vmaxps_avx(auVar93,auVar217);
  local_460._0_4_ = auVar93._0_4_ * 0.99999964;
  local_460._4_4_ = auVar93._4_4_ * 0.99999964;
  local_460._8_4_ = auVar93._8_4_ * 0.99999964;
  local_460._12_4_ = auVar93._12_4_ * 0.99999964;
  auVar93 = vpmaxsd_avx(auVar277,auVar123);
  auVar217 = vpmaxsd_avx(auVar192,auVar75);
  auVar93 = vminps_avx(auVar93,auVar217);
  auVar217 = vpmaxsd_avx(auVar214,auVar157);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar158._4_4_ = uVar5;
  auVar158._0_4_ = uVar5;
  auVar158._8_4_ = uVar5;
  auVar158._12_4_ = uVar5;
  auVar217 = vminps_avx(auVar217,auVar158);
  auVar93 = vminps_avx(auVar93,auVar217);
  auVar76._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar76._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar76._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar76._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar93 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar217 = vpcmpgtd_avx(auVar93,_DAT_01f7fcf0);
  auVar93 = vcmpps_avx(local_460,auVar76,2);
  auVar93 = vandps_avx(auVar93,auVar217);
  uVar64 = vmovmskps_avx(auVar93);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  uVar65 = 1 << ((byte)k & 0x1f);
  auVar55 = ZEXT412(0);
  do {
    auVar57._12_4_ = 0;
    auVar57._0_12_ = auVar55;
    lVar68 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
      }
    }
    uVar66 = *(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[uVar66].ptr;
    fVar119 = (pGVar9->time_range).lower;
    fVar119 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar119) / ((pGVar9->time_range).upper - fVar119));
    auVar93 = vroundss_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),9);
    auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
    auVar93 = vmaxss_avx(auVar57 << 0x20,auVar93);
    uVar8 = *(uint *)(prim + lVar68 * 4 + 6);
    uVar67 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             (ulong)uVar8 *
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar72 = (long)(int)auVar93._0_4_ * 0x38;
    lVar11 = *(long *)(_Var10 + lVar72);
    lVar12 = *(long *)(_Var10 + 0x10 + lVar72);
    pfVar3 = (float *)(lVar11 + lVar12 * uVar67);
    fVar120 = *pfVar3;
    fVar154 = pfVar3[1];
    fVar155 = pfVar3[2];
    fVar190 = pfVar3[3];
    lVar68 = uVar67 + 1;
    pfVar3 = (float *)(lVar11 + lVar12 * lVar68);
    fVar205 = *pfVar3;
    fVar206 = pfVar3[1];
    fVar207 = pfVar3[2];
    fVar210 = pfVar3[3];
    lVar1 = uVar67 + 2;
    pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
    fVar235 = *pfVar3;
    fVar238 = pfVar3[1];
    fVar241 = pfVar3[2];
    fVar244 = pfVar3[3];
    lVar2 = uVar67 + 3;
    pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
    fVar257 = *pfVar3;
    fVar258 = pfVar3[1];
    fVar259 = pfVar3[2];
    fVar208 = pfVar3[3];
    lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
    lVar12 = *(long *)(lVar11 + lVar72);
    lVar13 = *(long *)(lVar11 + 0x10 + lVar72);
    pfVar3 = (float *)(lVar12 + lVar13 * uVar67);
    fVar211 = *pfVar3;
    fVar236 = pfVar3[1];
    fVar239 = pfVar3[2];
    fVar242 = pfVar3[3];
    pfVar3 = (float *)(lVar12 + lVar13 * lVar68);
    fVar114 = *pfVar3;
    fVar212 = pfVar3[1];
    fVar237 = pfVar3[2];
    fVar240 = pfVar3[3];
    pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
    fVar113 = *pfVar3;
    fVar115 = pfVar3[1];
    fVar116 = pfVar3[2];
    fVar117 = pfVar3[3];
    fVar119 = fVar119 - auVar93._0_4_;
    pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
    fVar243 = *pfVar3;
    fVar118 = pfVar3[1];
    fVar209 = pfVar3[2];
    fVar260 = pfVar3[3];
    local_6e0._0_4_ =
         fVar120 * 0.16666667 + fVar205 * 0.6666667 + fVar235 * 0.16666667 + fVar257 * 0.0;
    local_6e0._4_4_ =
         fVar154 * 0.16666667 + fVar206 * 0.6666667 + fVar238 * 0.16666667 + fVar258 * 0.0;
    fStack_6d8 = fVar155 * 0.16666667 + fVar207 * 0.6666667 + fVar241 * 0.16666667 + fVar259 * 0.0;
    fStack_6d4 = fVar190 * 0.16666667 + fVar210 * 0.6666667 + fVar244 * 0.16666667 + fVar208 * 0.0;
    auVar77._0_4_ = fVar235 * 0.5 + fVar257 * 0.0;
    auVar77._4_4_ = fVar238 * 0.5 + fVar258 * 0.0;
    auVar77._8_4_ = fVar241 * 0.5 + fVar259 * 0.0;
    auVar77._12_4_ = fVar244 * 0.5 + fVar208 * 0.0;
    auVar159._0_4_ = fVar205 * 0.0;
    auVar159._4_4_ = fVar206 * 0.0;
    auVar159._8_4_ = fVar207 * 0.0;
    auVar159._12_4_ = fVar210 * 0.0;
    auVar93 = vsubps_avx(auVar77,auVar159);
    auVar160._0_4_ = fVar120 * 0.5;
    auVar160._4_4_ = fVar154 * 0.5;
    auVar160._8_4_ = fVar155 * 0.5;
    auVar160._12_4_ = fVar190 * 0.5;
    auVar146 = vsubps_avx(auVar93,auVar160);
    auVar78._0_4_ =
         fVar211 * 0.16666667 + fVar114 * 0.6666667 + fVar113 * 0.16666667 + fVar243 * 0.0;
    auVar78._4_4_ =
         fVar236 * 0.16666667 + fVar212 * 0.6666667 + fVar115 * 0.16666667 + fVar118 * 0.0;
    auVar78._8_4_ =
         fVar239 * 0.16666667 + fVar237 * 0.6666667 + fVar116 * 0.16666667 + fVar209 * 0.0;
    auVar78._12_4_ =
         fVar242 * 0.16666667 + fVar240 * 0.6666667 + fVar117 * 0.16666667 + fVar260 * 0.0;
    auVar263._0_4_ = fVar113 * 0.5 + fVar243 * 0.0;
    auVar263._4_4_ = fVar115 * 0.5 + fVar118 * 0.0;
    auVar263._8_4_ = fVar116 * 0.5 + fVar209 * 0.0;
    auVar263._12_4_ = fVar117 * 0.5 + fVar260 * 0.0;
    auVar341._0_4_ = fVar114 * 0.0;
    auVar341._4_4_ = fVar212 * 0.0;
    auVar341._8_4_ = fVar237 * 0.0;
    auVar341._12_4_ = fVar240 * 0.0;
    auVar93 = vsubps_avx(auVar263,auVar341);
    auVar342._0_4_ = fVar211 * 0.5;
    auVar342._4_4_ = fVar236 * 0.5;
    auVar342._8_4_ = fVar239 * 0.5;
    auVar342._12_4_ = fVar242 * 0.5;
    auVar294 = vsubps_avx(auVar93,auVar342);
    auVar215._0_4_ = fVar120 * 0.0;
    auVar215._4_4_ = fVar154 * 0.0;
    auVar215._8_4_ = fVar155 * 0.0;
    auVar215._12_4_ = fVar190 * 0.0;
    auVar264._0_4_ =
         auVar215._0_4_ + fVar205 * 0.16666667 + fVar235 * 0.6666667 + fVar257 * 0.16666667;
    auVar264._4_4_ =
         auVar215._4_4_ + fVar206 * 0.16666667 + fVar238 * 0.6666667 + fVar258 * 0.16666667;
    auVar264._8_4_ =
         auVar215._8_4_ + fVar207 * 0.16666667 + fVar241 * 0.6666667 + fVar259 * 0.16666667;
    auVar264._12_4_ =
         auVar215._12_4_ + fVar210 * 0.16666667 + fVar244 * 0.6666667 + fVar208 * 0.16666667;
    auVar278._0_4_ = fVar257 * 0.5 + fVar235 * 0.0;
    auVar278._4_4_ = fVar258 * 0.5 + fVar238 * 0.0;
    auVar278._8_4_ = fVar259 * 0.5 + fVar241 * 0.0;
    auVar278._12_4_ = fVar208 * 0.5 + fVar244 * 0.0;
    auVar193._0_4_ = fVar205 * 0.5;
    auVar193._4_4_ = fVar206 * 0.5;
    auVar193._8_4_ = fVar207 * 0.5;
    auVar193._12_4_ = fVar210 * 0.5;
    auVar93 = vsubps_avx(auVar278,auVar193);
    auVar134 = vsubps_avx(auVar93,auVar215);
    auVar216._0_4_ = fVar211 * 0.0;
    auVar216._4_4_ = fVar236 * 0.0;
    auVar216._8_4_ = fVar239 * 0.0;
    auVar216._12_4_ = fVar242 * 0.0;
    auVar194._0_4_ =
         auVar216._0_4_ + fVar114 * 0.16666667 + fVar113 * 0.6666667 + fVar243 * 0.16666667;
    auVar194._4_4_ =
         auVar216._4_4_ + fVar212 * 0.16666667 + fVar115 * 0.6666667 + fVar118 * 0.16666667;
    auVar194._8_4_ =
         auVar216._8_4_ + fVar237 * 0.16666667 + fVar116 * 0.6666667 + fVar209 * 0.16666667;
    auVar194._12_4_ =
         auVar216._12_4_ + fVar240 * 0.16666667 + fVar117 * 0.6666667 + fVar260 * 0.16666667;
    auVar279._0_4_ = fVar113 * 0.0 + fVar243 * 0.5;
    auVar279._4_4_ = fVar115 * 0.0 + fVar118 * 0.5;
    auVar279._8_4_ = fVar116 * 0.0 + fVar209 * 0.5;
    auVar279._12_4_ = fVar117 * 0.0 + fVar260 * 0.5;
    auVar246._0_4_ = fVar114 * 0.5;
    auVar246._4_4_ = fVar212 * 0.5;
    auVar246._8_4_ = fVar237 * 0.5;
    auVar246._12_4_ = fVar240 * 0.5;
    auVar93 = vsubps_avx(auVar279,auVar246);
    auVar16 = vsubps_avx(auVar93,auVar216);
    auVar93 = vshufps_avx(auVar146,auVar146,0xc9);
    auVar217 = vshufps_avx(auVar78,auVar78,0xc9);
    fVar113 = auVar146._0_4_;
    auVar247._0_4_ = fVar113 * auVar217._0_4_;
    fVar115 = auVar146._4_4_;
    auVar247._4_4_ = fVar115 * auVar217._4_4_;
    fVar116 = auVar146._8_4_;
    auVar247._8_4_ = fVar116 * auVar217._8_4_;
    fVar117 = auVar146._12_4_;
    auVar247._12_4_ = fVar117 * auVar217._12_4_;
    auVar79._0_4_ = auVar93._0_4_ * auVar78._0_4_;
    auVar79._4_4_ = auVar93._4_4_ * auVar78._4_4_;
    auVar79._8_4_ = auVar93._8_4_ * auVar78._8_4_;
    auVar79._12_4_ = auVar93._12_4_ * auVar78._12_4_;
    auVar217 = vsubps_avx(auVar79,auVar247);
    auVar186 = vshufps_avx(auVar217,auVar217,0xc9);
    auVar217 = vshufps_avx(auVar294,auVar294,0xc9);
    auVar80._0_4_ = fVar113 * auVar217._0_4_;
    auVar80._4_4_ = fVar115 * auVar217._4_4_;
    auVar80._8_4_ = fVar116 * auVar217._8_4_;
    auVar80._12_4_ = fVar117 * auVar217._12_4_;
    auVar280._0_4_ = auVar294._0_4_ * auVar93._0_4_;
    auVar280._4_4_ = auVar294._4_4_ * auVar93._4_4_;
    auVar280._8_4_ = auVar294._8_4_ * auVar93._8_4_;
    auVar280._12_4_ = auVar294._12_4_ * auVar93._12_4_;
    auVar93 = vsubps_avx(auVar280,auVar80);
    auVar294 = vshufps_avx(auVar93,auVar93,0xc9);
    auVar93 = vshufps_avx(auVar134,auVar134,0xc9);
    auVar217 = vshufps_avx(auVar194,auVar194,0xc9);
    fVar118 = auVar134._0_4_;
    auVar292._0_4_ = fVar118 * auVar217._0_4_;
    fVar209 = auVar134._4_4_;
    auVar292._4_4_ = fVar209 * auVar217._4_4_;
    fVar260 = auVar134._8_4_;
    auVar292._8_4_ = fVar260 * auVar217._8_4_;
    fVar286 = auVar134._12_4_;
    auVar292._12_4_ = fVar286 * auVar217._12_4_;
    auVar195._0_4_ = auVar93._0_4_ * auVar194._0_4_;
    auVar195._4_4_ = auVar93._4_4_ * auVar194._4_4_;
    auVar195._8_4_ = auVar93._8_4_ * auVar194._8_4_;
    auVar195._12_4_ = auVar93._12_4_ * auVar194._12_4_;
    auVar217 = vsubps_avx(auVar195,auVar292);
    auVar15 = vshufps_avx(auVar217,auVar217,0xc9);
    auVar217 = vshufps_avx(auVar16,auVar16,0xc9);
    auVar293._0_4_ = fVar118 * auVar217._0_4_;
    auVar293._4_4_ = fVar209 * auVar217._4_4_;
    auVar293._8_4_ = fVar260 * auVar217._8_4_;
    auVar293._12_4_ = fVar286 * auVar217._12_4_;
    auVar81._0_4_ = auVar93._0_4_ * auVar16._0_4_;
    auVar81._4_4_ = auVar93._4_4_ * auVar16._4_4_;
    auVar81._8_4_ = auVar93._8_4_ * auVar16._8_4_;
    auVar81._12_4_ = auVar93._12_4_ * auVar16._12_4_;
    auVar93 = vdpps_avx(auVar186,auVar186,0x7f);
    auVar217 = vsubps_avx(auVar81,auVar293);
    auVar16 = vshufps_avx(auVar217,auVar217,0xc9);
    fVar154 = auVar93._0_4_;
    auVar135 = ZEXT416((uint)fVar154);
    auVar217 = vrsqrtss_avx(auVar135,auVar135);
    fVar120 = auVar217._0_4_;
    auVar217 = ZEXT416((uint)(fVar120 * 1.5 - fVar154 * 0.5 * fVar120 * fVar120 * fVar120));
    auVar17 = vshufps_avx(auVar217,auVar217,0);
    fVar211 = auVar17._0_4_ * auVar186._0_4_;
    fVar236 = auVar17._4_4_ * auVar186._4_4_;
    fVar239 = auVar17._8_4_ * auVar186._8_4_;
    fVar242 = auVar17._12_4_ * auVar186._12_4_;
    auVar217 = vdpps_avx(auVar186,auVar294,0x7f);
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar281._0_4_ = auVar93._0_4_ * auVar294._0_4_;
    auVar281._4_4_ = auVar93._4_4_ * auVar294._4_4_;
    auVar281._8_4_ = auVar93._8_4_ * auVar294._8_4_;
    auVar281._12_4_ = auVar93._12_4_ * auVar294._12_4_;
    auVar93 = vshufps_avx(auVar217,auVar217,0);
    auVar248._0_4_ = auVar93._0_4_ * auVar186._0_4_;
    auVar248._4_4_ = auVar93._4_4_ * auVar186._4_4_;
    auVar248._8_4_ = auVar93._8_4_ * auVar186._8_4_;
    auVar248._12_4_ = auVar93._12_4_ * auVar186._12_4_;
    auVar172 = vsubps_avx(auVar281,auVar248);
    auVar93 = vrcpss_avx(auVar135,auVar135);
    auVar93 = ZEXT416((uint)((2.0 - fVar154 * auVar93._0_4_) * auVar93._0_4_));
    auVar186 = vshufps_avx(auVar93,auVar93,0);
    auVar93 = vdpps_avx(auVar15,auVar15,0x7f);
    fVar114 = auVar93._0_4_;
    auVar294 = ZEXT416((uint)fVar114);
    auVar217 = vrsqrtss_avx(auVar294,auVar294);
    fVar257 = auVar217._0_4_;
    auVar217 = vdpps_avx(auVar15,auVar16,0x7f);
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar365._0_4_ = auVar93._0_4_ * auVar16._0_4_;
    auVar365._4_4_ = auVar93._4_4_ * auVar16._4_4_;
    auVar365._8_4_ = auVar93._8_4_ * auVar16._8_4_;
    auVar365._12_4_ = auVar93._12_4_ * auVar16._12_4_;
    lVar12 = *(long *)(_Var10 + 0x38 + lVar72);
    lVar13 = *(long *)(_Var10 + 0x48 + lVar72);
    pauVar4 = (undefined1 (*) [16])(lVar12 + lVar13 * uVar67);
    auVar273 = *pauVar4;
    pfVar3 = (float *)(lVar12 + lVar13 * lVar68);
    fVar120 = *pfVar3;
    fVar154 = pfVar3[1];
    fVar155 = pfVar3[2];
    fVar190 = pfVar3[3];
    pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
    fVar205 = *pfVar3;
    fVar206 = pfVar3[1];
    fVar207 = pfVar3[2];
    fVar210 = pfVar3[3];
    auVar93 = vshufps_avx(auVar217,auVar217,0);
    auVar82._0_4_ = auVar93._0_4_ * auVar15._0_4_;
    auVar82._4_4_ = auVar93._4_4_ * auVar15._4_4_;
    auVar82._8_4_ = auVar93._8_4_ * auVar15._8_4_;
    auVar82._12_4_ = auVar93._12_4_ * auVar15._12_4_;
    auVar16 = vsubps_avx(auVar365,auVar82);
    pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
    fVar235 = *pfVar3;
    fVar238 = pfVar3[1];
    fVar241 = pfVar3[2];
    fVar244 = pfVar3[3];
    lVar12 = *(long *)(lVar11 + 0x38 + lVar72);
    lVar11 = *(long *)(lVar11 + 0x48 + lVar72);
    auVar93 = ZEXT416((uint)(fVar257 * 1.5 - fVar114 * 0.5 * fVar257 * fVar257 * fVar257));
    auVar217 = vshufps_avx(auVar93,auVar93,0);
    fVar257 = auVar217._0_4_ * auVar15._0_4_;
    fVar258 = auVar217._4_4_ * auVar15._4_4_;
    fVar259 = auVar217._8_4_ * auVar15._8_4_;
    fVar208 = auVar217._12_4_ * auVar15._12_4_;
    auVar93 = vrcpss_avx(auVar294,auVar294);
    auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - auVar93._0_4_ * fVar114)));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar294 = vshufps_avx(_local_6e0,_local_6e0,0xff);
    auVar324._0_4_ = auVar294._0_4_ * fVar211;
    auVar324._4_4_ = auVar294._4_4_ * fVar236;
    auVar324._8_4_ = auVar294._8_4_ * fVar239;
    auVar324._12_4_ = auVar294._12_4_ * fVar242;
    auVar15 = vshufps_avx(auVar146,auVar146,0xff);
    auVar135 = vsubps_avx(_local_6e0,auVar324);
    auVar218._0_4_ =
         auVar15._0_4_ * fVar211 + auVar294._0_4_ * auVar17._0_4_ * auVar172._0_4_ * auVar186._0_4_;
    auVar218._4_4_ =
         auVar15._4_4_ * fVar236 + auVar294._4_4_ * auVar17._4_4_ * auVar172._4_4_ * auVar186._4_4_;
    auVar218._8_4_ =
         auVar15._8_4_ * fVar239 + auVar294._8_4_ * auVar17._8_4_ * auVar172._8_4_ * auVar186._8_4_;
    auVar218._12_4_ =
         auVar15._12_4_ * fVar242 +
         auVar294._12_4_ * auVar17._12_4_ * auVar172._12_4_ * auVar186._12_4_;
    auVar17 = vsubps_avx(auVar146,auVar218);
    local_6e0._0_4_ = (float)local_6e0._0_4_ + auVar324._0_4_;
    local_6e0._4_4_ = (float)local_6e0._4_4_ + auVar324._4_4_;
    fStack_6d8 = fStack_6d8 + auVar324._8_4_;
    fStack_6d4 = fStack_6d4 + auVar324._12_4_;
    auVar186 = vshufps_avx(auVar264,auVar264,0xff);
    auVar161._0_4_ = auVar186._0_4_ * fVar257;
    auVar161._4_4_ = auVar186._4_4_ * fVar258;
    auVar161._8_4_ = auVar186._8_4_ * fVar259;
    auVar161._12_4_ = auVar186._12_4_ * fVar208;
    auVar294 = vshufps_avx(auVar134,auVar134,0xff);
    auVar146 = vsubps_avx(auVar264,auVar161);
    auVar83._0_4_ =
         auVar294._0_4_ * fVar257 + auVar186._0_4_ * auVar217._0_4_ * auVar16._0_4_ * auVar93._0_4_;
    auVar83._4_4_ =
         auVar294._4_4_ * fVar258 + auVar186._4_4_ * auVar217._4_4_ * auVar16._4_4_ * auVar93._4_4_;
    auVar83._8_4_ =
         auVar294._8_4_ * fVar259 + auVar186._8_4_ * auVar217._8_4_ * auVar16._8_4_ * auVar93._8_4_;
    auVar83._12_4_ =
         auVar294._12_4_ * fVar208 +
         auVar186._12_4_ * auVar217._12_4_ * auVar16._12_4_ * auVar93._12_4_;
    auVar134 = vsubps_avx(auVar134,auVar83);
    local_5f0._4_4_ = auVar264._4_4_ + auVar161._4_4_;
    local_5f0._0_4_ = auVar264._0_4_ + auVar161._0_4_;
    fStack_5e8 = auVar264._8_4_ + auVar161._8_4_;
    fStack_5e4 = auVar264._12_4_ + auVar161._12_4_;
    local_5e0._0_4_ =
         *(float *)*pauVar4 * 0.16666667 +
         fVar120 * 0.6666667 + fVar205 * 0.16666667 + fVar235 * 0.0;
    local_5e0._4_4_ =
         *(float *)(*pauVar4 + 4) * 0.16666667 +
         fVar154 * 0.6666667 + fVar206 * 0.16666667 + fVar238 * 0.0;
    fStack_5d8 = *(float *)(*pauVar4 + 8) * 0.16666667 +
                 fVar155 * 0.6666667 + fVar207 * 0.16666667 + fVar241 * 0.0;
    fStack_5d4 = *(float *)(*pauVar4 + 0xc) * 0.16666667 +
                 fVar190 * 0.6666667 + fVar210 * 0.16666667 + fVar244 * 0.0;
    auVar84._0_4_ = fVar205 * 0.5 + fVar235 * 0.0;
    auVar84._4_4_ = fVar206 * 0.5 + fVar238 * 0.0;
    auVar84._8_4_ = fVar207 * 0.5 + fVar241 * 0.0;
    auVar84._12_4_ = fVar210 * 0.5 + fVar244 * 0.0;
    auVar124._0_4_ = fVar120 * 0.0;
    auVar124._4_4_ = fVar154 * 0.0;
    auVar124._8_4_ = fVar155 * 0.0;
    auVar124._12_4_ = fVar190 * 0.0;
    auVar93 = vsubps_avx(auVar84,auVar124);
    auVar125._0_4_ = *(float *)*pauVar4 * 0.5;
    auVar125._4_4_ = *(float *)(*pauVar4 + 4) * 0.5;
    auVar125._8_4_ = *(float *)(*pauVar4 + 8) * 0.5;
    auVar125._12_4_ = *(float *)(*pauVar4 + 0xc) * 0.5;
    auVar172 = vsubps_avx(auVar93,auVar125);
    auVar93 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
    pfVar3 = (float *)(lVar12 + lVar11 * lVar2);
    fVar257 = *pfVar3;
    fVar258 = pfVar3[1];
    fVar259 = pfVar3[2];
    fVar208 = pfVar3[3];
    fVar243 = auVar93._0_4_;
    fVar287 = auVar93._4_4_;
    fVar304 = auVar93._8_4_;
    fVar305 = auVar93._12_4_;
    pfVar3 = (float *)(lVar12 + lVar68 * lVar11);
    fVar211 = *pfVar3;
    fVar236 = pfVar3[1];
    fVar239 = pfVar3[2];
    fVar242 = pfVar3[3];
    pfVar3 = (float *)(lVar12 + uVar67 * lVar11);
    fVar114 = *pfVar3;
    fVar212 = pfVar3[1];
    fVar237 = pfVar3[2];
    fVar240 = pfVar3[3];
    auVar219._0_4_ =
         fVar114 * 0.16666667 + fVar211 * 0.6666667 + fVar243 * 0.16666667 + fVar257 * 0.0;
    auVar219._4_4_ =
         fVar212 * 0.16666667 + fVar236 * 0.6666667 + fVar287 * 0.16666667 + fVar258 * 0.0;
    auVar219._8_4_ =
         fVar237 * 0.16666667 + fVar239 * 0.6666667 + fVar304 * 0.16666667 + fVar259 * 0.0;
    auVar219._12_4_ =
         fVar240 * 0.16666667 + fVar242 * 0.6666667 + fVar305 * 0.16666667 + fVar208 * 0.0;
    auVar196._0_4_ = fVar243 * 0.5 + fVar257 * 0.0;
    auVar196._4_4_ = fVar287 * 0.5 + fVar258 * 0.0;
    auVar196._8_4_ = fVar304 * 0.5 + fVar259 * 0.0;
    auVar196._12_4_ = fVar305 * 0.5 + fVar208 * 0.0;
    auVar295._0_4_ = fVar211 * 0.0;
    auVar295._4_4_ = fVar236 * 0.0;
    auVar295._8_4_ = fVar239 * 0.0;
    auVar295._12_4_ = fVar242 * 0.0;
    auVar93 = vsubps_avx(auVar196,auVar295);
    auVar296._0_4_ = fVar114 * 0.5;
    auVar296._4_4_ = fVar212 * 0.5;
    auVar296._8_4_ = fVar237 * 0.5;
    auVar296._12_4_ = fVar240 * 0.5;
    auVar217 = vsubps_avx(auVar93,auVar296);
    auVar297._0_4_ = fVar205 * 0.0 + fVar235 * 0.5;
    auVar297._4_4_ = fVar206 * 0.0 + fVar238 * 0.5;
    auVar297._8_4_ = fVar207 * 0.0 + fVar241 * 0.5;
    auVar297._12_4_ = fVar210 * 0.0 + fVar244 * 0.5;
    auVar343._0_4_ = fVar120 * 0.5;
    auVar343._4_4_ = fVar154 * 0.5;
    auVar343._8_4_ = fVar155 * 0.5;
    auVar343._12_4_ = fVar190 * 0.5;
    auVar93 = vsubps_avx(auVar297,auVar343);
    local_6a0 = auVar273._0_4_;
    fStack_69c = auVar273._4_4_;
    fStack_698 = auVar273._8_4_;
    fStack_694 = auVar273._12_4_;
    auVar331._0_4_ = local_6a0 * 0.0;
    auVar331._4_4_ = fStack_69c * 0.0;
    auVar331._8_4_ = fStack_698 * 0.0;
    auVar331._12_4_ = fStack_694 * 0.0;
    auVar344._0_4_ =
         auVar331._0_4_ + fVar120 * 0.16666667 + fVar235 * 0.16666667 + fVar205 * 0.6666667;
    auVar344._4_4_ =
         auVar331._4_4_ + fVar154 * 0.16666667 + fVar238 * 0.16666667 + fVar206 * 0.6666667;
    auVar344._8_4_ =
         auVar331._8_4_ + fVar155 * 0.16666667 + fVar241 * 0.16666667 + fVar207 * 0.6666667;
    auVar344._12_4_ =
         auVar331._12_4_ + fVar190 * 0.16666667 + fVar244 * 0.16666667 + fVar210 * 0.6666667;
    auVar273 = vsubps_avx(auVar93,auVar331);
    auVar162._0_4_ = fVar243 * 0.0 + fVar257 * 0.5;
    auVar162._4_4_ = fVar287 * 0.0 + fVar258 * 0.5;
    auVar162._8_4_ = fVar304 * 0.0 + fVar259 * 0.5;
    auVar162._12_4_ = fVar305 * 0.0 + fVar208 * 0.5;
    auVar85._0_4_ = fVar211 * 0.5;
    auVar85._4_4_ = fVar236 * 0.5;
    auVar85._8_4_ = fVar239 * 0.5;
    auVar85._12_4_ = fVar242 * 0.5;
    auVar93 = vsubps_avx(auVar162,auVar85);
    auVar126._0_4_ = fVar114 * 0.0;
    auVar126._4_4_ = fVar212 * 0.0;
    auVar126._8_4_ = fVar237 * 0.0;
    auVar126._12_4_ = fVar240 * 0.0;
    auVar163._0_4_ =
         auVar126._0_4_ + fVar211 * 0.16666667 + fVar243 * 0.6666667 + fVar257 * 0.16666667;
    auVar163._4_4_ =
         auVar126._4_4_ + fVar236 * 0.16666667 + fVar287 * 0.6666667 + fVar258 * 0.16666667;
    auVar163._8_4_ =
         auVar126._8_4_ + fVar239 * 0.16666667 + fVar304 * 0.6666667 + fVar259 * 0.16666667;
    auVar163._12_4_ =
         auVar126._12_4_ + fVar242 * 0.16666667 + fVar305 * 0.6666667 + fVar208 * 0.16666667;
    auVar186 = vsubps_avx(auVar93,auVar126);
    auVar93 = vshufps_avx(auVar219,auVar219,0xc9);
    fVar235 = auVar172._0_4_;
    auVar127._0_4_ = fVar235 * auVar93._0_4_;
    fVar238 = auVar172._4_4_;
    auVar127._4_4_ = fVar238 * auVar93._4_4_;
    fVar241 = auVar172._8_4_;
    auVar127._8_4_ = fVar241 * auVar93._8_4_;
    fVar257 = auVar172._12_4_;
    auVar127._12_4_ = fVar257 * auVar93._12_4_;
    auVar93 = vshufps_avx(auVar172,auVar172,0xc9);
    auVar220._0_4_ = auVar93._0_4_ * auVar219._0_4_;
    auVar220._4_4_ = auVar93._4_4_ * auVar219._4_4_;
    auVar220._8_4_ = auVar93._8_4_ * auVar219._8_4_;
    auVar220._12_4_ = auVar93._12_4_ * auVar219._12_4_;
    auVar294 = vsubps_avx(auVar220,auVar127);
    auVar128._0_4_ = auVar93._0_4_ * auVar217._0_4_;
    auVar128._4_4_ = auVar93._4_4_ * auVar217._4_4_;
    auVar128._8_4_ = auVar93._8_4_ * auVar217._8_4_;
    auVar128._12_4_ = auVar93._12_4_ * auVar217._12_4_;
    auVar93 = vshufps_avx(auVar217,auVar217,0xc9);
    auVar197._0_4_ = fVar235 * auVar93._0_4_;
    auVar197._4_4_ = fVar238 * auVar93._4_4_;
    auVar197._8_4_ = fVar241 * auVar93._8_4_;
    auVar197._12_4_ = fVar257 * auVar93._12_4_;
    auVar15 = vsubps_avx(auVar128,auVar197);
    auVar93 = vshufps_avx(auVar163,auVar163,0xc9);
    fVar244 = auVar273._0_4_;
    auVar129._0_4_ = fVar244 * auVar93._0_4_;
    fVar258 = auVar273._4_4_;
    auVar129._4_4_ = fVar258 * auVar93._4_4_;
    fVar259 = auVar273._8_4_;
    auVar129._8_4_ = fVar259 * auVar93._8_4_;
    fVar208 = auVar273._12_4_;
    auVar129._12_4_ = fVar208 * auVar93._12_4_;
    auVar93 = vshufps_avx(auVar273,auVar273,0xc9);
    auVar164._0_4_ = auVar93._0_4_ * auVar163._0_4_;
    auVar164._4_4_ = auVar93._4_4_ * auVar163._4_4_;
    auVar164._8_4_ = auVar93._8_4_ * auVar163._8_4_;
    auVar164._12_4_ = auVar93._12_4_ * auVar163._12_4_;
    auVar16 = vsubps_avx(auVar164,auVar129);
    auVar165._0_4_ = auVar93._0_4_ * auVar186._0_4_;
    auVar165._4_4_ = auVar93._4_4_ * auVar186._4_4_;
    auVar165._8_4_ = auVar93._8_4_ * auVar186._8_4_;
    auVar165._12_4_ = auVar93._12_4_ * auVar186._12_4_;
    auVar93 = vshufps_avx(auVar186,auVar186,0xc9);
    auVar86._0_4_ = fVar244 * auVar93._0_4_;
    auVar86._4_4_ = fVar258 * auVar93._4_4_;
    auVar86._8_4_ = fVar259 * auVar93._8_4_;
    auVar86._12_4_ = fVar208 * auVar93._12_4_;
    auVar74 = vsubps_avx(auVar165,auVar86);
    auVar186 = vshufps_avx(auVar294,auVar294,0xc9);
    auVar93 = vdpps_avx(auVar186,auVar186,0x7f);
    fVar120 = auVar93._0_4_;
    auVar76 = ZEXT416((uint)fVar120);
    auVar217 = vrsqrtss_avx(auVar76,auVar76);
    fVar154 = auVar217._0_4_;
    auVar294 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar217 = vdpps_avx(auVar186,auVar294,0x7f);
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar198._0_4_ = auVar93._0_4_ * auVar294._0_4_;
    auVar198._4_4_ = auVar93._4_4_ * auVar294._4_4_;
    auVar198._8_4_ = auVar93._8_4_ * auVar294._8_4_;
    auVar198._12_4_ = auVar93._12_4_ * auVar294._12_4_;
    auVar93 = vshufps_avx(auVar217,auVar217,0);
    auVar355._0_4_ = auVar93._0_4_ * auVar186._0_4_;
    auVar355._4_4_ = auVar93._4_4_ * auVar186._4_4_;
    auVar355._8_4_ = auVar93._8_4_ * auVar186._8_4_;
    auVar355._12_4_ = auVar93._12_4_ * auVar186._12_4_;
    auVar75 = vsubps_avx(auVar198,auVar355);
    auVar93 = vrcpss_avx(auVar76,auVar76);
    auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar120 * auVar93._0_4_)));
    auVar294 = vshufps_avx(auVar93,auVar93,0);
    auVar93 = ZEXT416((uint)(fVar154 * 1.5 - fVar120 * 0.5 * fVar154 * fVar154 * fVar154));
    auVar15 = vshufps_avx(auVar93,auVar93,0);
    fVar205 = auVar186._0_4_ * auVar15._0_4_;
    fVar206 = auVar186._4_4_ * auVar15._4_4_;
    fVar207 = auVar186._8_4_ * auVar15._8_4_;
    fVar210 = auVar186._12_4_ * auVar15._12_4_;
    auVar186 = vshufps_avx(auVar16,auVar16,0xc9);
    auVar93 = vdpps_avx(auVar186,auVar186,0x7f);
    fVar120 = auVar93._0_4_;
    auVar76 = ZEXT416((uint)fVar120);
    auVar217 = vrsqrtss_avx(auVar76,auVar76);
    fVar154 = auVar217._0_4_;
    auVar16 = vshufps_avx(auVar74,auVar74,0xc9);
    auVar217 = vdpps_avx(auVar186,auVar16,0x7f);
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar87._0_4_ = auVar93._0_4_ * auVar16._0_4_;
    auVar87._4_4_ = auVar93._4_4_ * auVar16._4_4_;
    auVar87._8_4_ = auVar93._8_4_ * auVar16._8_4_;
    auVar87._12_4_ = auVar93._12_4_ * auVar16._12_4_;
    auVar93 = vshufps_avx(auVar217,auVar217,0);
    auVar298._0_4_ = auVar93._0_4_ * auVar186._0_4_;
    auVar298._4_4_ = auVar93._4_4_ * auVar186._4_4_;
    auVar298._8_4_ = auVar93._8_4_ * auVar186._8_4_;
    auVar298._12_4_ = auVar93._12_4_ * auVar186._12_4_;
    auVar74 = vsubps_avx(auVar87,auVar298);
    auVar93 = vrcpss_avx(auVar76,auVar76);
    auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar120 * auVar93._0_4_)));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar217 = ZEXT416((uint)(fVar154 * 1.5 - fVar120 * 0.5 * fVar154 * fVar154 * fVar154));
    auVar217 = vshufps_avx(auVar217,auVar217,0);
    fVar120 = auVar186._0_4_ * auVar217._0_4_;
    fVar154 = auVar186._4_4_ * auVar217._4_4_;
    fVar155 = auVar186._8_4_ * auVar217._8_4_;
    fVar190 = auVar186._12_4_ * auVar217._12_4_;
    auVar186 = vshufps_avx(auVar172,auVar172,0xff);
    auVar16 = vshufps_avx(_local_5e0,_local_5e0,0xff);
    auVar166._0_4_ = auVar16._0_4_ * fVar205;
    auVar166._4_4_ = auVar16._4_4_ * fVar206;
    auVar166._8_4_ = auVar16._8_4_ * fVar207;
    auVar166._12_4_ = auVar16._12_4_ * fVar210;
    auVar199._0_4_ =
         auVar186._0_4_ * fVar205 + auVar15._0_4_ * auVar75._0_4_ * auVar294._0_4_ * auVar16._0_4_;
    auVar199._4_4_ =
         auVar186._4_4_ * fVar206 + auVar15._4_4_ * auVar75._4_4_ * auVar294._4_4_ * auVar16._4_4_;
    auVar199._8_4_ =
         auVar186._8_4_ * fVar207 + auVar15._8_4_ * auVar75._8_4_ * auVar294._8_4_ * auVar16._8_4_;
    auVar199._12_4_ =
         auVar186._12_4_ * fVar210 +
         auVar15._12_4_ * auVar75._12_4_ * auVar294._12_4_ * auVar16._12_4_;
    auVar15 = vsubps_avx(_local_5e0,auVar166);
    local_5e0._0_4_ = (float)local_5e0._0_4_ + auVar166._0_4_;
    local_5e0._4_4_ = (float)local_5e0._4_4_ + auVar166._4_4_;
    fStack_5d8 = fStack_5d8 + auVar166._8_4_;
    fStack_5d4 = fStack_5d4 + auVar166._12_4_;
    auVar16 = vsubps_avx(auVar172,auVar199);
    auVar186 = vshufps_avx(auVar273,auVar273,0xff);
    auVar294 = vshufps_avx(auVar344,auVar344,0xff);
    auVar130._0_4_ = auVar294._0_4_ * fVar120;
    auVar130._4_4_ = auVar294._4_4_ * fVar154;
    auVar130._8_4_ = auVar294._8_4_ * fVar155;
    auVar130._12_4_ = auVar294._12_4_ * fVar190;
    auVar167._0_4_ =
         auVar186._0_4_ * fVar120 + auVar294._0_4_ * auVar217._0_4_ * auVar74._0_4_ * auVar93._0_4_;
    auVar167._4_4_ =
         auVar186._4_4_ * fVar154 + auVar294._4_4_ * auVar217._4_4_ * auVar74._4_4_ * auVar93._4_4_;
    auVar167._8_4_ =
         auVar186._8_4_ * fVar155 + auVar294._8_4_ * auVar217._8_4_ * auVar74._8_4_ * auVar93._8_4_;
    auVar167._12_4_ =
         auVar186._12_4_ * fVar190 +
         auVar294._12_4_ * auVar217._12_4_ * auVar74._12_4_ * auVar93._12_4_;
    auVar186 = vsubps_avx(auVar344,auVar130);
    auVar356._0_4_ = auVar344._0_4_ + auVar130._0_4_;
    auVar356._4_4_ = auVar344._4_4_ + auVar130._4_4_;
    auVar356._8_4_ = auVar344._8_4_ + auVar130._8_4_;
    auVar356._12_4_ = auVar344._12_4_ + auVar130._12_4_;
    auVar294 = vsubps_avx(auVar273,auVar167);
    local_680 = auVar17._0_4_;
    fStack_67c = auVar17._4_4_;
    fStack_678 = auVar17._8_4_;
    fStack_674 = auVar17._12_4_;
    local_660 = auVar135._0_4_;
    fStack_65c = auVar135._4_4_;
    fStack_658 = auVar135._8_4_;
    fStack_654 = auVar135._12_4_;
    auVar93 = vshufps_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),0);
    auVar217 = vshufps_avx(ZEXT416((uint)(1.0 - fVar119)),ZEXT416((uint)(1.0 - fVar119)),0);
    fVar190 = auVar93._0_4_;
    fVar205 = auVar93._4_4_;
    fVar206 = auVar93._8_4_;
    fVar207 = auVar93._12_4_;
    fVar119 = auVar217._0_4_;
    fVar120 = auVar217._4_4_;
    fVar154 = auVar217._8_4_;
    fVar155 = auVar217._12_4_;
    local_480._0_4_ = fVar119 * local_660 + fVar190 * auVar15._0_4_;
    local_480._4_4_ = fVar120 * fStack_65c + fVar205 * auVar15._4_4_;
    fStack_478 = fVar154 * fStack_658 + fVar206 * auVar15._8_4_;
    fStack_474 = fVar155 * fStack_654 + fVar207 * auVar15._12_4_;
    fVar212 = (local_660 + local_680 * 0.33333334) * fVar119 +
              fVar190 * (auVar15._0_4_ + auVar16._0_4_ * 0.33333334);
    fVar237 = (fStack_65c + fStack_67c * 0.33333334) * fVar120 +
              fVar205 * (auVar15._4_4_ + auVar16._4_4_ * 0.33333334);
    fVar240 = (fStack_658 + fStack_678 * 0.33333334) * fVar154 +
              fVar206 * (auVar15._8_4_ + auVar16._8_4_ * 0.33333334);
    fVar243 = (fStack_654 + fStack_674 * 0.33333334) * fVar155 +
              fVar207 * (auVar15._12_4_ + auVar16._12_4_ * 0.33333334);
    local_6c0 = auVar134._0_4_;
    fStack_6bc = auVar134._4_4_;
    fStack_6b8 = auVar134._8_4_;
    fStack_6b4 = auVar134._12_4_;
    auVar221._0_4_ = local_6c0 * 0.33333334;
    auVar221._4_4_ = fStack_6bc * 0.33333334;
    auVar221._8_4_ = fStack_6b8 * 0.33333334;
    auVar221._12_4_ = fStack_6b4 * 0.33333334;
    auVar93 = vsubps_avx(auVar146,auVar221);
    auVar265._0_4_ = (fVar118 + auVar83._0_4_) * 0.33333334;
    auVar265._4_4_ = (fVar209 + auVar83._4_4_) * 0.33333334;
    auVar265._8_4_ = (fVar260 + auVar83._8_4_) * 0.33333334;
    auVar265._12_4_ = (fVar286 + auVar83._12_4_) * 0.33333334;
    auVar217 = vsubps_avx(_local_5f0,auVar265);
    auVar299._0_4_ = auVar294._0_4_ * 0.33333334;
    auVar299._4_4_ = auVar294._4_4_ * 0.33333334;
    auVar299._8_4_ = auVar294._8_4_ * 0.33333334;
    auVar299._12_4_ = auVar294._12_4_ * 0.33333334;
    auVar294 = vsubps_avx(auVar186,auVar299);
    auVar168._0_4_ = (fVar244 + auVar167._0_4_) * 0.33333334;
    auVar168._4_4_ = (fVar258 + auVar167._4_4_) * 0.33333334;
    auVar168._8_4_ = (fVar259 + auVar167._8_4_) * 0.33333334;
    auVar168._12_4_ = (fVar208 + auVar167._12_4_) * 0.33333334;
    auVar15 = vsubps_avx(auVar356,auVar168);
    local_490._0_4_ = auVar294._0_4_ * fVar190 + fVar119 * auVar93._0_4_;
    local_490._4_4_ = auVar294._4_4_ * fVar205 + fVar120 * auVar93._4_4_;
    fStack_488 = auVar294._8_4_ * fVar206 + fVar154 * auVar93._8_4_;
    fStack_484 = auVar294._12_4_ * fVar207 + fVar155 * auVar93._12_4_;
    fVar244 = fVar119 * auVar146._0_4_ + fVar190 * auVar186._0_4_;
    fVar259 = fVar120 * auVar146._4_4_ + fVar205 * auVar186._4_4_;
    fVar236 = fVar154 * auVar146._8_4_ + fVar206 * auVar186._8_4_;
    fVar242 = fVar155 * auVar146._12_4_ + fVar207 * auVar186._12_4_;
    local_4a0._0_4_ = (float)local_6e0._0_4_ * fVar119 + fVar190 * (float)local_5e0._0_4_;
    local_4a0._4_4_ = (float)local_6e0._4_4_ * fVar120 + fVar205 * (float)local_5e0._4_4_;
    fStack_498 = fStack_6d8 * fVar154 + fVar206 * fStack_5d8;
    fStack_494 = fStack_6d4 * fVar155 + fVar207 * fStack_5d4;
    local_4b0._0_4_ =
         ((float)local_6e0._0_4_ + (fVar113 + auVar218._0_4_) * 0.33333334) * fVar119 +
         ((fVar235 + auVar199._0_4_) * 0.33333334 + (float)local_5e0._0_4_) * fVar190;
    local_4b0._4_4_ =
         ((float)local_6e0._4_4_ + (fVar115 + auVar218._4_4_) * 0.33333334) * fVar120 +
         ((fVar238 + auVar199._4_4_) * 0.33333334 + (float)local_5e0._4_4_) * fVar205;
    fStack_4a8 = (fStack_6d8 + (fVar116 + auVar218._8_4_) * 0.33333334) * fVar154 +
                 ((fVar241 + auVar199._8_4_) * 0.33333334 + fStack_5d8) * fVar206;
    fStack_4a4 = (fStack_6d4 + (fVar117 + auVar218._12_4_) * 0.33333334) * fVar155 +
                 ((fVar257 + auVar199._12_4_) * 0.33333334 + fStack_5d4) * fVar207;
    fVar257 = fVar119 * auVar217._0_4_ + fVar190 * auVar15._0_4_;
    fVar208 = fVar120 * auVar217._4_4_ + fVar205 * auVar15._4_4_;
    fVar239 = fVar154 * auVar217._8_4_ + fVar206 * auVar15._8_4_;
    fVar114 = fVar155 * auVar217._12_4_ + fVar207 * auVar15._12_4_;
    auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    local_410._0_4_ = (auVar264._0_4_ + auVar161._0_4_) * fVar119 + auVar356._0_4_ * fVar190;
    local_410._4_4_ = (auVar264._4_4_ + auVar161._4_4_) * fVar120 + auVar356._4_4_ * fVar205;
    fStack_408 = (auVar264._8_4_ + auVar161._8_4_) * fVar154 + auVar356._8_4_ * fVar206;
    fStack_404 = (auVar264._12_4_ + auVar161._12_4_) * fVar155 + auVar356._12_4_ * fVar207;
    auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_380 = vsubps_avx(_local_480,auVar93);
    auVar186 = vmovsldup_avx(local_380);
    auVar217 = vmovshdup_avx(local_380);
    auVar294 = vshufps_avx(local_380,local_380,0xaa);
    fVar119 = pre->ray_space[k].vx.field_0.m128[0];
    fVar120 = pre->ray_space[k].vx.field_0.m128[1];
    fVar154 = pre->ray_space[k].vx.field_0.m128[2];
    fVar155 = pre->ray_space[k].vx.field_0.m128[3];
    fVar190 = pre->ray_space[k].vy.field_0.m128[0];
    fVar205 = pre->ray_space[k].vy.field_0.m128[1];
    fVar206 = pre->ray_space[k].vy.field_0.m128[2];
    fVar207 = pre->ray_space[k].vy.field_0.m128[3];
    fVar210 = pre->ray_space[k].vz.field_0.m128[0];
    fVar235 = pre->ray_space[k].vz.field_0.m128[1];
    fVar238 = pre->ray_space[k].vz.field_0.m128[2];
    fVar241 = pre->ray_space[k].vz.field_0.m128[3];
    auVar360._0_4_ = fVar119 * auVar186._0_4_ + fVar190 * auVar217._0_4_ + fVar210 * auVar294._0_4_;
    auVar360._4_4_ = fVar120 * auVar186._4_4_ + fVar205 * auVar217._4_4_ + fVar235 * auVar294._4_4_;
    auVar360._8_4_ = fVar154 * auVar186._8_4_ + fVar206 * auVar217._8_4_ + fVar238 * auVar294._8_4_;
    auVar360._12_4_ =
         fVar155 * auVar186._12_4_ + fVar207 * auVar217._12_4_ + fVar241 * auVar294._12_4_;
    auVar62._4_4_ = fVar237;
    auVar62._0_4_ = fVar212;
    auVar62._8_4_ = fVar240;
    auVar62._12_4_ = fVar243;
    local_390 = vsubps_avx(auVar62,auVar93);
    auVar294 = vshufps_avx(local_390,local_390,0xaa);
    auVar217 = vmovshdup_avx(local_390);
    auVar186 = vmovsldup_avx(local_390);
    fVar258 = fVar119 * auVar186._0_4_ + fVar190 * auVar217._0_4_ + fVar210 * auVar294._0_4_;
    fVar211 = fVar120 * auVar186._4_4_ + fVar205 * auVar217._4_4_ + fVar235 * auVar294._4_4_;
    local_6d0._4_4_ = fVar211;
    local_6d0._0_4_ = fVar258;
    fStack_6c8 = fVar154 * auVar186._8_4_ + fVar206 * auVar217._8_4_ + fVar238 * auVar294._8_4_;
    fStack_6c4 = fVar155 * auVar186._12_4_ + fVar207 * auVar217._12_4_ + fVar241 * auVar294._12_4_;
    local_3a0 = vsubps_avx(_local_490,auVar93);
    auVar294 = vshufps_avx(local_3a0,local_3a0,0xaa);
    auVar217 = vmovshdup_avx(local_3a0);
    auVar186 = vmovsldup_avx(local_3a0);
    auVar357._0_4_ = fVar119 * auVar186._0_4_ + fVar190 * auVar217._0_4_ + fVar210 * auVar294._0_4_;
    auVar357._4_4_ = fVar120 * auVar186._4_4_ + fVar205 * auVar217._4_4_ + fVar235 * auVar294._4_4_;
    auVar357._8_4_ = fVar154 * auVar186._8_4_ + fVar206 * auVar217._8_4_ + fVar238 * auVar294._8_4_;
    auVar357._12_4_ =
         fVar155 * auVar186._12_4_ + fVar207 * auVar217._12_4_ + fVar241 * auVar294._12_4_;
    auVar60._4_4_ = fVar259;
    auVar60._0_4_ = fVar244;
    auVar60._8_4_ = fVar236;
    auVar60._12_4_ = fVar242;
    local_3b0 = vsubps_avx(auVar60,auVar93);
    auVar294 = vshufps_avx(local_3b0,local_3b0,0xaa);
    auVar217 = vmovshdup_avx(local_3b0);
    auVar186 = vmovsldup_avx(local_3b0);
    auVar131._0_4_ = auVar186._0_4_ * fVar119 + auVar217._0_4_ * fVar190 + fVar210 * auVar294._0_4_;
    auVar131._4_4_ = auVar186._4_4_ * fVar120 + auVar217._4_4_ * fVar205 + fVar235 * auVar294._4_4_;
    auVar131._8_4_ = auVar186._8_4_ * fVar154 + auVar217._8_4_ * fVar206 + fVar238 * auVar294._8_4_;
    auVar131._12_4_ =
         auVar186._12_4_ * fVar155 + auVar217._12_4_ * fVar207 + fVar241 * auVar294._12_4_;
    local_3c0 = vsubps_avx(_local_4a0,auVar93);
    auVar294 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar217 = vmovshdup_avx(local_3c0);
    auVar186 = vmovsldup_avx(local_3c0);
    auVar300._0_4_ = auVar186._0_4_ * fVar119 + auVar217._0_4_ * fVar190 + auVar294._0_4_ * fVar210;
    auVar300._4_4_ = auVar186._4_4_ * fVar120 + auVar217._4_4_ * fVar205 + auVar294._4_4_ * fVar235;
    auVar300._8_4_ = auVar186._8_4_ * fVar154 + auVar217._8_4_ * fVar206 + auVar294._8_4_ * fVar238;
    auVar300._12_4_ =
         auVar186._12_4_ * fVar155 + auVar217._12_4_ * fVar207 + auVar294._12_4_ * fVar241;
    local_3d0 = vsubps_avx(_local_4b0,auVar93);
    auVar294 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar217 = vmovshdup_avx(local_3d0);
    auVar186 = vmovsldup_avx(local_3d0);
    auVar311._0_4_ = auVar186._0_4_ * fVar119 + auVar217._0_4_ * fVar190 + auVar294._0_4_ * fVar210;
    auVar311._4_4_ = auVar186._4_4_ * fVar120 + auVar217._4_4_ * fVar205 + auVar294._4_4_ * fVar235;
    auVar311._8_4_ = auVar186._8_4_ * fVar154 + auVar217._8_4_ * fVar206 + auVar294._8_4_ * fVar238;
    auVar311._12_4_ =
         auVar186._12_4_ * fVar155 + auVar217._12_4_ * fVar207 + auVar294._12_4_ * fVar241;
    auVar58._4_4_ = fVar208;
    auVar58._0_4_ = fVar257;
    auVar58._8_4_ = fVar239;
    auVar58._12_4_ = fVar114;
    local_3e0 = vsubps_avx(auVar58,auVar93);
    auVar294 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar217 = vmovshdup_avx(local_3e0);
    auVar186 = vmovsldup_avx(local_3e0);
    auVar325._0_4_ = auVar186._0_4_ * fVar119 + auVar217._0_4_ * fVar190 + auVar294._0_4_ * fVar210;
    auVar325._4_4_ = auVar186._4_4_ * fVar120 + auVar217._4_4_ * fVar205 + auVar294._4_4_ * fVar235;
    auVar325._8_4_ = auVar186._8_4_ * fVar154 + auVar217._8_4_ * fVar206 + auVar294._8_4_ * fVar238;
    auVar325._12_4_ =
         auVar186._12_4_ * fVar155 + auVar217._12_4_ * fVar207 + auVar294._12_4_ * fVar241;
    local_3f0 = vsubps_avx(_local_410,auVar93);
    auVar186 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar93 = vmovshdup_avx(local_3f0);
    auVar217 = vmovsldup_avx(local_3f0);
    auVar88._0_4_ = fVar119 * auVar217._0_4_ + fVar190 * auVar93._0_4_ + fVar210 * auVar186._0_4_;
    auVar88._4_4_ = fVar120 * auVar217._4_4_ + fVar205 * auVar93._4_4_ + fVar235 * auVar186._4_4_;
    auVar88._8_4_ = fVar154 * auVar217._8_4_ + fVar206 * auVar93._8_4_ + fVar238 * auVar186._8_4_;
    auVar88._12_4_ =
         fVar155 * auVar217._12_4_ + fVar207 * auVar93._12_4_ + fVar241 * auVar186._12_4_;
    auVar294 = vmovlhps_avx(auVar360,auVar300);
    auVar15 = vmovlhps_avx(_local_6d0,auVar311);
    auVar16 = vmovlhps_avx(auVar357,auVar325);
    auVar17 = vmovlhps_avx(auVar131,auVar88);
    auVar93 = vminps_avx(auVar294,auVar15);
    auVar217 = vminps_avx(auVar16,auVar17);
    auVar186 = vminps_avx(auVar93,auVar217);
    auVar93 = vmaxps_avx(auVar294,auVar15);
    auVar217 = vmaxps_avx(auVar16,auVar17);
    auVar93 = vmaxps_avx(auVar93,auVar217);
    auVar217 = vshufpd_avx(auVar186,auVar186,3);
    auVar186 = vminps_avx(auVar186,auVar217);
    auVar217 = vshufpd_avx(auVar93,auVar93,3);
    auVar217 = vmaxps_avx(auVar93,auVar217);
    auVar266._8_4_ = 0x7fffffff;
    auVar266._0_8_ = 0x7fffffff7fffffff;
    auVar266._12_4_ = 0x7fffffff;
    auVar93 = vandps_avx(auVar186,auVar266);
    auVar217 = vandps_avx(auVar217,auVar266);
    auVar93 = vmaxps_avx(auVar93,auVar217);
    auVar217 = vmovshdup_avx(auVar93);
    auVar93 = vmaxss_avx(auVar217,auVar93);
    fVar120 = auVar93._0_4_ * 9.536743e-07;
    auVar93 = vshufps_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),0);
    local_320._16_16_ = auVar93;
    local_320._0_16_ = auVar93;
    auVar89._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
    auVar89._8_4_ = auVar93._8_4_ ^ 0x80000000;
    auVar89._12_4_ = auVar93._12_4_ ^ 0x80000000;
    local_340._16_16_ = auVar89;
    local_340._0_16_ = auVar89;
    auVar93 = vpshufd_avx(ZEXT416(uVar66),0);
    local_2c0._16_16_ = auVar93;
    local_2c0._0_16_ = auVar93;
    auVar93 = vpshufd_avx(ZEXT416(uVar8),0);
    local_2e0._16_16_ = auVar93;
    local_2e0._0_16_ = auVar93;
    uVar73 = 0;
    fVar119 = *(float *)(ray + k * 4 + 0x60);
    _local_350 = vsubps_avx(auVar15,auVar294);
    _local_360 = vsubps_avx(auVar16,auVar15);
    _local_370 = vsubps_avx(auVar17,auVar16);
    _local_420 = vsubps_avx(_local_4a0,_local_480);
    auVar63._4_4_ = fVar237;
    auVar63._0_4_ = fVar212;
    auVar63._8_4_ = fVar240;
    auVar63._12_4_ = fVar243;
    _local_430 = vsubps_avx(_local_4b0,auVar63);
    auVar59._4_4_ = fVar208;
    auVar59._0_4_ = fVar257;
    auVar59._8_4_ = fVar239;
    auVar59._12_4_ = fVar114;
    _local_440 = vsubps_avx(auVar59,_local_490);
    auVar61._4_4_ = fVar259;
    auVar61._0_4_ = fVar244;
    auVar61._8_4_ = fVar236;
    auVar61._12_4_ = fVar242;
    _local_450 = vsubps_avx(_local_410,auVar61);
    auVar338 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar367 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00f5b18c:
    auVar121 = auVar367._0_16_;
    local_400 = auVar121;
    auVar76 = auVar338._0_16_;
    auVar93 = vshufps_avx(auVar76,auVar76,0x50);
    auVar361._8_4_ = 0x3f800000;
    auVar361._0_8_ = 0x3f8000003f800000;
    auVar361._12_4_ = 0x3f800000;
    auVar364._16_4_ = 0x3f800000;
    auVar364._0_16_ = auVar361;
    auVar364._20_4_ = 0x3f800000;
    auVar364._24_4_ = 0x3f800000;
    auVar364._28_4_ = 0x3f800000;
    auVar217 = vsubps_avx(auVar361,auVar93);
    fVar154 = auVar93._0_4_;
    fVar155 = auVar93._4_4_;
    fVar190 = auVar93._8_4_;
    fVar205 = auVar93._12_4_;
    fVar206 = auVar217._0_4_;
    fVar207 = auVar217._4_4_;
    fVar210 = auVar217._8_4_;
    fVar235 = auVar217._12_4_;
    auVar200._0_4_ = auVar300._0_4_ * fVar154 + fVar206 * auVar360._0_4_;
    auVar200._4_4_ = auVar300._4_4_ * fVar155 + fVar207 * auVar360._4_4_;
    auVar200._8_4_ = auVar300._0_4_ * fVar190 + fVar210 * auVar360._0_4_;
    auVar200._12_4_ = auVar300._4_4_ * fVar205 + fVar235 * auVar360._4_4_;
    auVar169._0_4_ = auVar311._0_4_ * fVar154 + fVar206 * fVar258;
    auVar169._4_4_ = auVar311._4_4_ * fVar155 + fVar207 * fVar211;
    auVar169._8_4_ = auVar311._0_4_ * fVar190 + fVar210 * fVar258;
    auVar169._12_4_ = auVar311._4_4_ * fVar205 + fVar235 * fVar211;
    auVar282._0_4_ = auVar325._0_4_ * fVar154 + auVar357._0_4_ * fVar206;
    auVar282._4_4_ = auVar325._4_4_ * fVar155 + auVar357._4_4_ * fVar207;
    auVar282._8_4_ = auVar325._0_4_ * fVar190 + auVar357._0_4_ * fVar210;
    auVar282._12_4_ = auVar325._4_4_ * fVar205 + auVar357._4_4_ * fVar235;
    auVar222._0_4_ = auVar88._0_4_ * fVar154 + auVar131._0_4_ * fVar206;
    auVar222._4_4_ = auVar88._4_4_ * fVar155 + auVar131._4_4_ * fVar207;
    auVar222._8_4_ = auVar88._0_4_ * fVar190 + auVar131._0_4_ * fVar210;
    auVar222._12_4_ = auVar88._4_4_ * fVar205 + auVar131._4_4_ * fVar235;
    auVar93 = vmovshdup_avx(auVar121);
    auVar217 = vshufps_avx(auVar121,auVar121,0);
    auVar315._16_16_ = auVar217;
    auVar315._0_16_ = auVar217;
    auVar186 = vshufps_avx(auVar121,auVar121,0x55);
    auVar106._16_16_ = auVar186;
    auVar106._0_16_ = auVar186;
    auVar105 = vsubps_avx(auVar106,auVar315);
    auVar186 = vshufps_avx(auVar200,auVar200,0);
    auVar146 = vshufps_avx(auVar200,auVar200,0x55);
    auVar134 = vshufps_avx(auVar169,auVar169,0);
    auVar172 = vshufps_avx(auVar169,auVar169,0x55);
    auVar135 = vshufps_avx(auVar282,auVar282,0);
    auVar273 = vshufps_avx(auVar282,auVar282,0x55);
    auVar74 = vshufps_avx(auVar222,auVar222,0);
    auVar75 = vshufps_avx(auVar222,auVar222,0x55);
    auVar93 = ZEXT416((uint)((auVar93._0_4_ - auVar367._0_4_) * 0.04761905));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar329._0_4_ = auVar217._0_4_ + auVar105._0_4_ * 0.0;
    auVar329._4_4_ = auVar217._4_4_ + auVar105._4_4_ * 0.14285715;
    auVar329._8_4_ = auVar217._8_4_ + auVar105._8_4_ * 0.2857143;
    auVar329._12_4_ = auVar217._12_4_ + auVar105._12_4_ * 0.42857146;
    auVar329._16_4_ = auVar217._0_4_ + auVar105._16_4_ * 0.5714286;
    auVar329._20_4_ = auVar217._4_4_ + auVar105._20_4_ * 0.71428573;
    auVar329._24_4_ = auVar217._8_4_ + auVar105._24_4_ * 0.8571429;
    auVar329._28_4_ = auVar217._12_4_ + auVar105._28_4_;
    auVar18 = vsubps_avx(auVar364,auVar329);
    fVar154 = auVar134._0_4_;
    fVar190 = auVar134._4_4_;
    fVar206 = auVar134._8_4_;
    fVar210 = auVar134._12_4_;
    fVar309 = auVar18._0_4_;
    fVar317 = auVar18._4_4_;
    fVar318 = auVar18._8_4_;
    fVar319 = auVar18._12_4_;
    fVar320 = auVar18._16_4_;
    fVar321 = auVar18._20_4_;
    fVar322 = auVar18._24_4_;
    fVar305 = auVar172._0_4_;
    fVar306 = auVar172._4_4_;
    fVar307 = auVar172._8_4_;
    fVar308 = auVar172._12_4_;
    fVar359 = auVar146._12_4_ + 1.0;
    fVar260 = auVar135._0_4_;
    fVar286 = auVar135._4_4_;
    fVar287 = auVar135._8_4_;
    fVar304 = auVar135._12_4_;
    fVar238 = fVar260 * auVar329._0_4_ + fVar309 * fVar154;
    fVar241 = fVar286 * auVar329._4_4_ + fVar317 * fVar190;
    fVar113 = fVar287 * auVar329._8_4_ + fVar318 * fVar206;
    fVar115 = fVar304 * auVar329._12_4_ + fVar319 * fVar210;
    fVar116 = fVar260 * auVar329._16_4_ + fVar320 * fVar154;
    fVar117 = fVar286 * auVar329._20_4_ + fVar321 * fVar190;
    fVar118 = fVar287 * auVar329._24_4_ + fVar322 * fVar206;
    fVar155 = auVar273._0_4_;
    fVar205 = auVar273._4_4_;
    fVar207 = auVar273._8_4_;
    fVar235 = auVar273._12_4_;
    fVar339 = fVar305 * fVar309 + auVar329._0_4_ * fVar155;
    fVar347 = fVar306 * fVar317 + auVar329._4_4_ * fVar205;
    fVar348 = fVar307 * fVar318 + auVar329._8_4_ * fVar207;
    fVar349 = fVar308 * fVar319 + auVar329._12_4_ * fVar235;
    fVar350 = fVar305 * fVar320 + auVar329._16_4_ * fVar155;
    fVar351 = fVar306 * fVar321 + auVar329._20_4_ * fVar205;
    fVar352 = fVar307 * fVar322 + auVar329._24_4_ * fVar207;
    fVar353 = fVar308 + fVar210;
    auVar217 = vshufps_avx(auVar200,auVar200,0xaa);
    auVar134 = vshufps_avx(auVar200,auVar200,0xff);
    fVar209 = fVar304 + 0.0;
    auVar172 = vshufps_avx(auVar169,auVar169,0xaa);
    auVar135 = vshufps_avx(auVar169,auVar169,0xff);
    auVar233._0_4_ =
         fVar309 * (auVar329._0_4_ * fVar154 + fVar309 * auVar186._0_4_) + auVar329._0_4_ * fVar238;
    auVar233._4_4_ =
         fVar317 * (auVar329._4_4_ * fVar190 + fVar317 * auVar186._4_4_) + auVar329._4_4_ * fVar241;
    auVar233._8_4_ =
         fVar318 * (auVar329._8_4_ * fVar206 + fVar318 * auVar186._8_4_) + auVar329._8_4_ * fVar113;
    auVar233._12_4_ =
         fVar319 * (auVar329._12_4_ * fVar210 + fVar319 * auVar186._12_4_) +
         auVar329._12_4_ * fVar115;
    auVar233._16_4_ =
         fVar320 * (auVar329._16_4_ * fVar154 + fVar320 * auVar186._0_4_) +
         auVar329._16_4_ * fVar116;
    auVar233._20_4_ =
         fVar321 * (auVar329._20_4_ * fVar190 + fVar321 * auVar186._4_4_) +
         auVar329._20_4_ * fVar117;
    auVar233._24_4_ =
         fVar322 * (auVar329._24_4_ * fVar206 + fVar322 * auVar186._8_4_) +
         auVar329._24_4_ * fVar118;
    auVar233._28_4_ = auVar186._12_4_ + 1.0 + fVar235;
    auVar255._0_4_ =
         fVar309 * (fVar305 * auVar329._0_4_ + auVar146._0_4_ * fVar309) + auVar329._0_4_ * fVar339;
    auVar255._4_4_ =
         fVar317 * (fVar306 * auVar329._4_4_ + auVar146._4_4_ * fVar317) + auVar329._4_4_ * fVar347;
    auVar255._8_4_ =
         fVar318 * (fVar307 * auVar329._8_4_ + auVar146._8_4_ * fVar318) + auVar329._8_4_ * fVar348;
    auVar255._12_4_ =
         fVar319 * (fVar308 * auVar329._12_4_ + auVar146._12_4_ * fVar319) +
         auVar329._12_4_ * fVar349;
    auVar255._16_4_ =
         fVar320 * (fVar305 * auVar329._16_4_ + auVar146._0_4_ * fVar320) +
         auVar329._16_4_ * fVar350;
    auVar255._20_4_ =
         fVar321 * (fVar306 * auVar329._20_4_ + auVar146._4_4_ * fVar321) +
         auVar329._20_4_ * fVar351;
    auVar255._24_4_ =
         fVar322 * (fVar307 * auVar329._24_4_ + auVar146._8_4_ * fVar322) +
         auVar329._24_4_ * fVar352;
    auVar255._28_4_ = auVar75._12_4_ + fVar235;
    auVar107._0_4_ =
         fVar309 * fVar238 + auVar329._0_4_ * (fVar260 * fVar309 + auVar74._0_4_ * auVar329._0_4_);
    auVar107._4_4_ =
         fVar317 * fVar241 + auVar329._4_4_ * (fVar286 * fVar317 + auVar74._4_4_ * auVar329._4_4_);
    auVar107._8_4_ =
         fVar318 * fVar113 + auVar329._8_4_ * (fVar287 * fVar318 + auVar74._8_4_ * auVar329._8_4_);
    auVar107._12_4_ =
         fVar319 * fVar115 +
         auVar329._12_4_ * (fVar304 * fVar319 + auVar74._12_4_ * auVar329._12_4_);
    auVar107._16_4_ =
         fVar320 * fVar116 + auVar329._16_4_ * (fVar260 * fVar320 + auVar74._0_4_ * auVar329._16_4_)
    ;
    auVar107._20_4_ =
         fVar321 * fVar117 + auVar329._20_4_ * (fVar286 * fVar321 + auVar74._4_4_ * auVar329._20_4_)
    ;
    auVar107._24_4_ =
         fVar322 * fVar118 + auVar329._24_4_ * (fVar287 * fVar322 + auVar74._8_4_ * auVar329._24_4_)
    ;
    auVar107._28_4_ = fVar210 + 1.0 + fVar209;
    auVar337._0_4_ =
         fVar309 * fVar339 + auVar329._0_4_ * (auVar75._0_4_ * auVar329._0_4_ + fVar309 * fVar155);
    auVar337._4_4_ =
         fVar317 * fVar347 + auVar329._4_4_ * (auVar75._4_4_ * auVar329._4_4_ + fVar317 * fVar205);
    auVar337._8_4_ =
         fVar318 * fVar348 + auVar329._8_4_ * (auVar75._8_4_ * auVar329._8_4_ + fVar318 * fVar207);
    auVar337._12_4_ =
         fVar319 * fVar349 +
         auVar329._12_4_ * (auVar75._12_4_ * auVar329._12_4_ + fVar319 * fVar235);
    auVar337._16_4_ =
         fVar320 * fVar350 + auVar329._16_4_ * (auVar75._0_4_ * auVar329._16_4_ + fVar320 * fVar155)
    ;
    auVar337._20_4_ =
         fVar321 * fVar351 + auVar329._20_4_ * (auVar75._4_4_ * auVar329._20_4_ + fVar321 * fVar205)
    ;
    auVar337._24_4_ =
         fVar322 * fVar352 + auVar329._24_4_ * (auVar75._8_4_ * auVar329._24_4_ + fVar322 * fVar207)
    ;
    auVar337._28_4_ = fVar209 + fVar235 + 0.0;
    local_1e0._0_4_ = fVar309 * auVar233._0_4_ + auVar329._0_4_ * auVar107._0_4_;
    local_1e0._4_4_ = fVar317 * auVar233._4_4_ + auVar329._4_4_ * auVar107._4_4_;
    local_1e0._8_4_ = fVar318 * auVar233._8_4_ + auVar329._8_4_ * auVar107._8_4_;
    local_1e0._12_4_ = fVar319 * auVar233._12_4_ + auVar329._12_4_ * auVar107._12_4_;
    local_1e0._16_4_ = fVar320 * auVar233._16_4_ + auVar329._16_4_ * auVar107._16_4_;
    local_1e0._20_4_ = fVar321 * auVar233._20_4_ + auVar329._20_4_ * auVar107._20_4_;
    local_1e0._24_4_ = fVar322 * auVar233._24_4_ + auVar329._24_4_ * auVar107._24_4_;
    local_1e0._28_4_ = fVar353 + fVar235 + 0.0;
    auVar204._0_4_ = fVar309 * auVar255._0_4_ + auVar329._0_4_ * auVar337._0_4_;
    auVar204._4_4_ = fVar317 * auVar255._4_4_ + auVar329._4_4_ * auVar337._4_4_;
    auVar204._8_4_ = fVar318 * auVar255._8_4_ + auVar329._8_4_ * auVar337._8_4_;
    auVar204._12_4_ = fVar319 * auVar255._12_4_ + auVar329._12_4_ * auVar337._12_4_;
    auVar204._16_4_ = fVar320 * auVar255._16_4_ + auVar329._16_4_ * auVar337._16_4_;
    auVar204._20_4_ = fVar321 * auVar255._20_4_ + auVar329._20_4_ * auVar337._20_4_;
    auVar204._24_4_ = fVar322 * auVar255._24_4_ + auVar329._24_4_ * auVar337._24_4_;
    auVar204._28_4_ = fVar353 + fVar209;
    auVar19 = vsubps_avx(auVar107,auVar233);
    auVar105 = vsubps_avx(auVar337,auVar255);
    local_6a0 = auVar93._0_4_;
    fStack_69c = auVar93._4_4_;
    fStack_698 = auVar93._8_4_;
    fStack_694 = auVar93._12_4_;
    local_220 = local_6a0 * auVar19._0_4_ * 3.0;
    fStack_21c = fStack_69c * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_21c;
    auVar20._0_4_ = local_220;
    fStack_218 = fStack_698 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_218;
    fStack_214 = fStack_694 * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_214;
    fStack_210 = local_6a0 * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_210;
    fStack_20c = fStack_69c * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_20c;
    fStack_208 = fStack_698 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_208;
    auVar20._28_4_ = auVar19._28_4_;
    local_240 = local_6a0 * auVar105._0_4_ * 3.0;
    fStack_23c = fStack_69c * auVar105._4_4_ * 3.0;
    auVar21._4_4_ = fStack_23c;
    auVar21._0_4_ = local_240;
    fStack_238 = fStack_698 * auVar105._8_4_ * 3.0;
    auVar21._8_4_ = fStack_238;
    fStack_234 = fStack_694 * auVar105._12_4_ * 3.0;
    auVar21._12_4_ = fStack_234;
    fStack_230 = local_6a0 * auVar105._16_4_ * 3.0;
    auVar21._16_4_ = fStack_230;
    fStack_22c = fStack_69c * auVar105._20_4_ * 3.0;
    auVar21._20_4_ = fStack_22c;
    fStack_228 = fStack_698 * auVar105._24_4_ * 3.0;
    auVar21._24_4_ = fStack_228;
    auVar21._28_4_ = fVar353;
    auVar20 = vsubps_avx(local_1e0,auVar20);
    auVar105 = vperm2f128_avx(auVar20,auVar20,1);
    auVar105 = vshufps_avx(auVar105,auVar20,0x30);
    auVar105 = vshufps_avx(auVar20,auVar105,0x29);
    auVar21 = vsubps_avx(auVar204,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar20,0x29);
    fVar351 = auVar172._0_4_;
    fVar352 = auVar172._4_4_;
    fVar368 = auVar172._8_4_;
    fVar210 = auVar217._12_4_;
    fVar286 = auVar135._0_4_;
    fVar304 = auVar135._4_4_;
    fVar339 = auVar135._8_4_;
    fVar347 = auVar135._12_4_;
    auVar93 = vshufps_avx(auVar282,auVar282,0xaa);
    fVar154 = auVar93._0_4_;
    fVar190 = auVar93._4_4_;
    fVar206 = auVar93._8_4_;
    fVar235 = auVar93._12_4_;
    fVar113 = auVar329._0_4_ * fVar154 + fVar351 * fVar309;
    fVar115 = auVar329._4_4_ * fVar190 + fVar352 * fVar317;
    fVar116 = auVar329._8_4_ * fVar206 + fVar368 * fVar318;
    fVar117 = auVar329._12_4_ * fVar235 + auVar172._12_4_ * fVar319;
    fVar118 = auVar329._16_4_ * fVar154 + fVar351 * fVar320;
    fVar209 = auVar329._20_4_ * fVar190 + fVar352 * fVar321;
    fVar260 = auVar329._24_4_ * fVar206 + fVar368 * fVar322;
    auVar93 = vshufps_avx(auVar282,auVar282,0xff);
    fVar155 = auVar93._0_4_;
    fVar205 = auVar93._4_4_;
    fVar207 = auVar93._8_4_;
    fVar238 = auVar93._12_4_;
    fVar287 = auVar329._0_4_ * fVar155 + fVar286 * fVar309;
    fVar305 = auVar329._4_4_ * fVar205 + fVar304 * fVar317;
    fVar306 = auVar329._8_4_ * fVar207 + fVar339 * fVar318;
    fVar307 = auVar329._12_4_ * fVar238 + fVar347 * fVar319;
    fVar348 = auVar329._16_4_ * fVar155 + fVar286 * fVar320;
    fVar308 = auVar329._20_4_ * fVar205 + fVar304 * fVar321;
    fVar349 = auVar329._24_4_ * fVar207 + fVar339 * fVar322;
    auVar93 = vshufps_avx(auVar222,auVar222,0xaa);
    fVar350 = auVar93._12_4_ + fVar235;
    auVar186 = vshufps_avx(auVar222,auVar222,0xff);
    fVar241 = auVar186._12_4_;
    auVar108._0_4_ =
         fVar309 * (fVar351 * auVar329._0_4_ + fVar309 * auVar217._0_4_) + auVar329._0_4_ * fVar113;
    auVar108._4_4_ =
         fVar317 * (fVar352 * auVar329._4_4_ + fVar317 * auVar217._4_4_) + auVar329._4_4_ * fVar115;
    auVar108._8_4_ =
         fVar318 * (fVar368 * auVar329._8_4_ + fVar318 * auVar217._8_4_) + auVar329._8_4_ * fVar116;
    auVar108._12_4_ =
         fVar319 * (auVar172._12_4_ * auVar329._12_4_ + fVar319 * fVar210) +
         auVar329._12_4_ * fVar117;
    auVar108._16_4_ =
         fVar320 * (fVar351 * auVar329._16_4_ + fVar320 * auVar217._0_4_) +
         auVar329._16_4_ * fVar118;
    auVar108._20_4_ =
         fVar321 * (fVar352 * auVar329._20_4_ + fVar321 * auVar217._4_4_) +
         auVar329._20_4_ * fVar209;
    auVar108._24_4_ =
         fVar322 * (fVar368 * auVar329._24_4_ + fVar322 * auVar217._8_4_) +
         auVar329._24_4_ * fVar260;
    auVar108._28_4_ = auVar21._28_4_ + fVar210 + fVar241;
    auVar150._0_4_ =
         fVar309 * (fVar286 * auVar329._0_4_ + auVar134._0_4_ * fVar309) + auVar329._0_4_ * fVar287;
    auVar150._4_4_ =
         fVar317 * (fVar304 * auVar329._4_4_ + auVar134._4_4_ * fVar317) + auVar329._4_4_ * fVar305;
    auVar150._8_4_ =
         fVar318 * (fVar339 * auVar329._8_4_ + auVar134._8_4_ * fVar318) + auVar329._8_4_ * fVar306;
    auVar150._12_4_ =
         fVar319 * (fVar347 * auVar329._12_4_ + auVar134._12_4_ * fVar319) +
         auVar329._12_4_ * fVar307;
    auVar150._16_4_ =
         fVar320 * (fVar286 * auVar329._16_4_ + auVar134._0_4_ * fVar320) +
         auVar329._16_4_ * fVar348;
    auVar150._20_4_ =
         fVar321 * (fVar304 * auVar329._20_4_ + auVar134._4_4_ * fVar321) +
         auVar329._20_4_ * fVar308;
    auVar150._24_4_ =
         fVar322 * (fVar339 * auVar329._24_4_ + auVar134._8_4_ * fVar322) +
         auVar329._24_4_ * fVar349;
    auVar150._28_4_ = fVar210 + auVar20._28_4_ + fVar241;
    auVar20 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar20 = vshufps_avx(auVar20,local_1e0,0x30);
    auVar106 = vshufps_avx(local_1e0,auVar20,0x29);
    auVar256._0_4_ =
         auVar329._0_4_ * (auVar93._0_4_ * auVar329._0_4_ + fVar309 * fVar154) + fVar309 * fVar113;
    auVar256._4_4_ =
         auVar329._4_4_ * (auVar93._4_4_ * auVar329._4_4_ + fVar317 * fVar190) + fVar317 * fVar115;
    auVar256._8_4_ =
         auVar329._8_4_ * (auVar93._8_4_ * auVar329._8_4_ + fVar318 * fVar206) + fVar318 * fVar116;
    auVar256._12_4_ =
         auVar329._12_4_ * (auVar93._12_4_ * auVar329._12_4_ + fVar319 * fVar235) +
         fVar319 * fVar117;
    auVar256._16_4_ =
         auVar329._16_4_ * (auVar93._0_4_ * auVar329._16_4_ + fVar320 * fVar154) + fVar320 * fVar118
    ;
    auVar256._20_4_ =
         auVar329._20_4_ * (auVar93._4_4_ * auVar329._20_4_ + fVar321 * fVar190) + fVar321 * fVar209
    ;
    auVar256._24_4_ =
         auVar329._24_4_ * (auVar93._8_4_ * auVar329._24_4_ + fVar322 * fVar206) + fVar322 * fVar260
    ;
    auVar256._28_4_ = fVar350 + fVar359 + auVar255._28_4_;
    auVar303._0_4_ =
         fVar309 * fVar287 + auVar329._0_4_ * (auVar329._0_4_ * auVar186._0_4_ + fVar309 * fVar155);
    auVar303._4_4_ =
         fVar317 * fVar305 + auVar329._4_4_ * (auVar329._4_4_ * auVar186._4_4_ + fVar317 * fVar205);
    auVar303._8_4_ =
         fVar318 * fVar306 + auVar329._8_4_ * (auVar329._8_4_ * auVar186._8_4_ + fVar318 * fVar207);
    auVar303._12_4_ =
         fVar319 * fVar307 + auVar329._12_4_ * (auVar329._12_4_ * fVar241 + fVar319 * fVar238);
    auVar303._16_4_ =
         fVar320 * fVar348 +
         auVar329._16_4_ * (auVar329._16_4_ * auVar186._0_4_ + fVar320 * fVar155);
    auVar303._20_4_ =
         fVar321 * fVar308 +
         auVar329._20_4_ * (auVar329._20_4_ * auVar186._4_4_ + fVar321 * fVar205);
    auVar303._24_4_ =
         fVar322 * fVar349 +
         auVar329._24_4_ * (auVar329._24_4_ * auVar186._8_4_ + fVar322 * fVar207);
    auVar303._28_4_ = fVar359 + fVar347 + fVar241 + fVar238;
    auVar285._0_4_ = fVar309 * auVar108._0_4_ + auVar329._0_4_ * auVar256._0_4_;
    auVar285._4_4_ = fVar317 * auVar108._4_4_ + auVar329._4_4_ * auVar256._4_4_;
    auVar285._8_4_ = fVar318 * auVar108._8_4_ + auVar329._8_4_ * auVar256._8_4_;
    auVar285._12_4_ = fVar319 * auVar108._12_4_ + auVar329._12_4_ * auVar256._12_4_;
    auVar285._16_4_ = fVar320 * auVar108._16_4_ + auVar329._16_4_ * auVar256._16_4_;
    auVar285._20_4_ = fVar321 * auVar108._20_4_ + auVar329._20_4_ * auVar256._20_4_;
    auVar285._24_4_ = fVar322 * auVar108._24_4_ + auVar329._24_4_ * auVar256._24_4_;
    auVar285._28_4_ = fVar350 + fVar241 + fVar238;
    auVar316._0_4_ = fVar309 * auVar150._0_4_ + auVar329._0_4_ * auVar303._0_4_;
    auVar316._4_4_ = fVar317 * auVar150._4_4_ + auVar329._4_4_ * auVar303._4_4_;
    auVar316._8_4_ = fVar318 * auVar150._8_4_ + auVar329._8_4_ * auVar303._8_4_;
    auVar316._12_4_ = fVar319 * auVar150._12_4_ + auVar329._12_4_ * auVar303._12_4_;
    auVar316._16_4_ = fVar320 * auVar150._16_4_ + auVar329._16_4_ * auVar303._16_4_;
    auVar316._20_4_ = fVar321 * auVar150._20_4_ + auVar329._20_4_ * auVar303._20_4_;
    auVar316._24_4_ = fVar322 * auVar150._24_4_ + auVar329._24_4_ * auVar303._24_4_;
    auVar316._28_4_ = auVar18._28_4_ + auVar329._28_4_;
    auVar22 = vsubps_avx(auVar256,auVar108);
    auVar20 = vsubps_avx(auVar303,auVar150);
    local_260 = local_6a0 * auVar22._0_4_ * 3.0;
    fStack_25c = fStack_69c * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_25c;
    auVar18._0_4_ = local_260;
    fStack_258 = fStack_698 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_258;
    fStack_254 = fStack_694 * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_254;
    fStack_250 = local_6a0 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_250;
    fStack_24c = fStack_69c * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_24c;
    fStack_248 = fStack_698 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_248;
    auVar18._28_4_ = auVar22._28_4_;
    local_280 = local_6a0 * auVar20._0_4_ * 3.0;
    fStack_27c = fStack_69c * auVar20._4_4_ * 3.0;
    auVar23._4_4_ = fStack_27c;
    auVar23._0_4_ = local_280;
    fStack_278 = fStack_698 * auVar20._8_4_ * 3.0;
    auVar23._8_4_ = fStack_278;
    fStack_274 = fStack_694 * auVar20._12_4_ * 3.0;
    auVar23._12_4_ = fStack_274;
    fStack_270 = local_6a0 * auVar20._16_4_ * 3.0;
    auVar23._16_4_ = fStack_270;
    fStack_26c = fStack_69c * auVar20._20_4_ * 3.0;
    auVar23._20_4_ = fStack_26c;
    fStack_268 = fStack_698 * auVar20._24_4_ * 3.0;
    auVar23._24_4_ = fStack_268;
    auVar23._28_4_ = auVar256._28_4_;
    auVar20 = vperm2f128_avx(auVar285,auVar285,1);
    auVar20 = vshufps_avx(auVar20,auVar285,0x30);
    auVar107 = vshufps_avx(auVar285,auVar20,0x29);
    auVar18 = vsubps_avx(auVar285,auVar18);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar20 = vshufps_avx(auVar18,auVar20,0x29);
    auVar23 = vsubps_avx(auVar316,auVar23);
    auVar18 = vperm2f128_avx(auVar23,auVar23,1);
    auVar18 = vshufps_avx(auVar18,auVar23,0x30);
    auVar23 = vshufps_avx(auVar23,auVar18,0x29);
    auVar24 = vsubps_avx(auVar285,local_1e0);
    auVar108 = vsubps_avx(auVar107,auVar106);
    fVar154 = auVar108._0_4_ + auVar24._0_4_;
    fVar155 = auVar108._4_4_ + auVar24._4_4_;
    fVar190 = auVar108._8_4_ + auVar24._8_4_;
    fVar205 = auVar108._12_4_ + auVar24._12_4_;
    fVar206 = auVar108._16_4_ + auVar24._16_4_;
    fVar207 = auVar108._20_4_ + auVar24._20_4_;
    fVar210 = auVar108._24_4_ + auVar24._24_4_;
    auVar18 = vperm2f128_avx(auVar204,auVar204,1);
    auVar18 = vshufps_avx(auVar18,auVar204,0x30);
    local_200 = vshufps_avx(auVar204,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar316,auVar316,1);
    auVar18 = vshufps_avx(auVar18,auVar316,0x30);
    local_1c0 = vshufps_avx(auVar316,auVar18,0x29);
    auVar18 = vsubps_avx(auVar316,auVar204);
    auVar150 = vsubps_avx(local_1c0,local_200);
    fVar235 = auVar150._0_4_ + auVar18._0_4_;
    fVar238 = auVar150._4_4_ + auVar18._4_4_;
    fVar241 = auVar150._8_4_ + auVar18._8_4_;
    fVar113 = auVar150._12_4_ + auVar18._12_4_;
    fVar115 = auVar150._16_4_ + auVar18._16_4_;
    fVar116 = auVar150._20_4_ + auVar18._20_4_;
    fVar117 = auVar150._24_4_ + auVar18._24_4_;
    auVar25._4_4_ = fVar155 * auVar204._4_4_;
    auVar25._0_4_ = fVar154 * auVar204._0_4_;
    auVar25._8_4_ = fVar190 * auVar204._8_4_;
    auVar25._12_4_ = fVar205 * auVar204._12_4_;
    auVar25._16_4_ = fVar206 * auVar204._16_4_;
    auVar25._20_4_ = fVar207 * auVar204._20_4_;
    auVar25._24_4_ = fVar210 * auVar204._24_4_;
    auVar25._28_4_ = auVar18._28_4_;
    auVar26._4_4_ = fVar238 * local_1e0._4_4_;
    auVar26._0_4_ = fVar235 * local_1e0._0_4_;
    auVar26._8_4_ = fVar241 * local_1e0._8_4_;
    auVar26._12_4_ = fVar113 * local_1e0._12_4_;
    auVar26._16_4_ = fVar115 * local_1e0._16_4_;
    auVar26._20_4_ = fVar116 * local_1e0._20_4_;
    auVar26._24_4_ = fVar117 * local_1e0._24_4_;
    auVar26._28_4_ = fVar350;
    auVar25 = vsubps_avx(auVar25,auVar26);
    local_220 = local_1e0._0_4_ + local_220;
    fStack_21c = local_1e0._4_4_ + fStack_21c;
    fStack_218 = local_1e0._8_4_ + fStack_218;
    fStack_214 = local_1e0._12_4_ + fStack_214;
    fStack_210 = local_1e0._16_4_ + fStack_210;
    fStack_20c = local_1e0._20_4_ + fStack_20c;
    fStack_208 = local_1e0._24_4_ + fStack_208;
    fStack_204 = local_1e0._28_4_ + auVar19._28_4_;
    local_240 = local_240 + auVar204._0_4_;
    fStack_23c = fStack_23c + auVar204._4_4_;
    fStack_238 = fStack_238 + auVar204._8_4_;
    fStack_234 = fStack_234 + auVar204._12_4_;
    fStack_230 = fStack_230 + auVar204._16_4_;
    fStack_22c = fStack_22c + auVar204._20_4_;
    fStack_228 = fStack_228 + auVar204._24_4_;
    fStack_224 = fVar353 + auVar204._28_4_;
    auVar19._4_4_ = fVar155 * fStack_23c;
    auVar19._0_4_ = fVar154 * local_240;
    auVar19._8_4_ = fVar190 * fStack_238;
    auVar19._12_4_ = fVar205 * fStack_234;
    auVar19._16_4_ = fVar206 * fStack_230;
    auVar19._20_4_ = fVar207 * fStack_22c;
    auVar19._24_4_ = fVar210 * fStack_228;
    auVar19._28_4_ = fVar353;
    auVar27._4_4_ = fVar238 * fStack_21c;
    auVar27._0_4_ = fVar235 * local_220;
    auVar27._8_4_ = fVar241 * fStack_218;
    auVar27._12_4_ = fVar113 * fStack_214;
    auVar27._16_4_ = fVar115 * fStack_210;
    auVar27._20_4_ = fVar116 * fStack_20c;
    auVar27._24_4_ = fVar117 * fStack_208;
    auVar27._28_4_ = fVar353 + auVar204._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar27);
    local_660 = auVar21._0_4_;
    fStack_65c = auVar21._4_4_;
    fStack_658 = auVar21._8_4_;
    fStack_654 = auVar21._12_4_;
    fStack_650 = auVar21._16_4_;
    fStack_64c = auVar21._20_4_;
    fStack_648 = auVar21._24_4_;
    auVar28._4_4_ = fVar155 * fStack_65c;
    auVar28._0_4_ = fVar154 * local_660;
    auVar28._8_4_ = fVar190 * fStack_658;
    auVar28._12_4_ = fVar205 * fStack_654;
    auVar28._16_4_ = fVar206 * fStack_650;
    auVar28._20_4_ = fVar207 * fStack_64c;
    auVar28._24_4_ = fVar210 * fStack_648;
    auVar28._28_4_ = fVar353;
    local_6c0 = auVar105._0_4_;
    fStack_6bc = auVar105._4_4_;
    fStack_6b8 = auVar105._8_4_;
    fStack_6b4 = auVar105._12_4_;
    fStack_6b0 = auVar105._16_4_;
    fStack_6ac = auVar105._20_4_;
    fStack_6a8 = auVar105._24_4_;
    auVar29._4_4_ = fVar238 * fStack_6bc;
    auVar29._0_4_ = fVar235 * local_6c0;
    auVar29._8_4_ = fVar241 * fStack_6b8;
    auVar29._12_4_ = fVar113 * fStack_6b4;
    auVar29._16_4_ = fVar115 * fStack_6b0;
    auVar29._20_4_ = fVar116 * fStack_6ac;
    auVar29._24_4_ = fVar117 * fStack_6a8;
    auVar29._28_4_ = local_1e0._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_200._4_4_ * fVar155;
    auVar30._0_4_ = local_200._0_4_ * fVar154;
    auVar30._8_4_ = local_200._8_4_ * fVar190;
    auVar30._12_4_ = local_200._12_4_ * fVar205;
    auVar30._16_4_ = local_200._16_4_ * fVar206;
    auVar30._20_4_ = local_200._20_4_ * fVar207;
    auVar30._24_4_ = local_200._24_4_ * fVar210;
    auVar30._28_4_ = fVar353;
    auVar31._4_4_ = auVar106._4_4_ * fVar238;
    auVar31._0_4_ = auVar106._0_4_ * fVar235;
    auVar31._8_4_ = auVar106._8_4_ * fVar241;
    auVar31._12_4_ = auVar106._12_4_ * fVar113;
    auVar31._16_4_ = auVar106._16_4_ * fVar115;
    auVar31._20_4_ = auVar106._20_4_ * fVar116;
    auVar31._24_4_ = auVar106._24_4_ * fVar117;
    auVar31._28_4_ = local_200._28_4_;
    local_6a0 = auVar20._0_4_;
    fStack_69c = auVar20._4_4_;
    fStack_698 = auVar20._8_4_;
    fStack_694 = auVar20._12_4_;
    fStack_690 = auVar20._16_4_;
    fStack_68c = auVar20._20_4_;
    fStack_688 = auVar20._24_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar316._4_4_ * fVar155;
    auVar32._0_4_ = auVar316._0_4_ * fVar154;
    auVar32._8_4_ = auVar316._8_4_ * fVar190;
    auVar32._12_4_ = auVar316._12_4_ * fVar205;
    auVar32._16_4_ = auVar316._16_4_ * fVar206;
    auVar32._20_4_ = auVar316._20_4_ * fVar207;
    auVar32._24_4_ = auVar316._24_4_ * fVar210;
    auVar32._28_4_ = fVar353;
    auVar33._4_4_ = fVar238 * auVar285._4_4_;
    auVar33._0_4_ = fVar235 * auVar285._0_4_;
    auVar33._8_4_ = fVar241 * auVar285._8_4_;
    auVar33._12_4_ = fVar113 * auVar285._12_4_;
    auVar33._16_4_ = fVar115 * auVar285._16_4_;
    auVar33._20_4_ = fVar116 * auVar285._20_4_;
    auVar33._24_4_ = fVar117 * auVar285._24_4_;
    auVar33._28_4_ = fStack_204;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_260 = auVar285._0_4_ + local_260;
    fStack_25c = auVar285._4_4_ + fStack_25c;
    fStack_258 = auVar285._8_4_ + fStack_258;
    fStack_254 = auVar285._12_4_ + fStack_254;
    fStack_250 = auVar285._16_4_ + fStack_250;
    fStack_24c = auVar285._20_4_ + fStack_24c;
    fStack_248 = auVar285._24_4_ + fStack_248;
    fStack_244 = auVar285._28_4_ + auVar22._28_4_;
    local_280 = auVar316._0_4_ + local_280;
    fStack_27c = auVar316._4_4_ + fStack_27c;
    fStack_278 = auVar316._8_4_ + fStack_278;
    fStack_274 = auVar316._12_4_ + fStack_274;
    fStack_270 = auVar316._16_4_ + fStack_270;
    fStack_26c = auVar316._20_4_ + fStack_26c;
    fStack_268 = auVar316._24_4_ + fStack_268;
    fStack_264 = auVar316._28_4_ + auVar256._28_4_;
    auVar22._4_4_ = fVar155 * fStack_27c;
    auVar22._0_4_ = fVar154 * local_280;
    auVar22._8_4_ = fVar190 * fStack_278;
    auVar22._12_4_ = fVar205 * fStack_274;
    auVar22._16_4_ = fVar206 * fStack_270;
    auVar22._20_4_ = fVar207 * fStack_26c;
    auVar22._24_4_ = fVar210 * fStack_268;
    auVar22._28_4_ = auVar316._28_4_ + auVar256._28_4_;
    auVar34._4_4_ = fStack_25c * fVar238;
    auVar34._0_4_ = local_260 * fVar235;
    auVar34._8_4_ = fStack_258 * fVar241;
    auVar34._12_4_ = fStack_254 * fVar113;
    auVar34._16_4_ = fStack_250 * fVar115;
    auVar34._20_4_ = fStack_24c * fVar116;
    auVar34._24_4_ = fStack_248 * fVar117;
    auVar34._28_4_ = fStack_244;
    auVar22 = vsubps_avx(auVar22,auVar34);
    auVar35._4_4_ = fVar155 * auVar23._4_4_;
    auVar35._0_4_ = fVar154 * auVar23._0_4_;
    auVar35._8_4_ = fVar190 * auVar23._8_4_;
    auVar35._12_4_ = fVar205 * auVar23._12_4_;
    auVar35._16_4_ = fVar206 * auVar23._16_4_;
    auVar35._20_4_ = fVar207 * auVar23._20_4_;
    auVar35._24_4_ = fVar210 * auVar23._24_4_;
    auVar35._28_4_ = fStack_244;
    auVar36._4_4_ = fVar238 * fStack_69c;
    auVar36._0_4_ = fVar235 * local_6a0;
    auVar36._8_4_ = fVar241 * fStack_698;
    auVar36._12_4_ = fVar113 * fStack_694;
    auVar36._16_4_ = fVar115 * fStack_690;
    auVar36._20_4_ = fVar116 * fStack_68c;
    auVar36._24_4_ = fVar117 * fStack_688;
    auVar36._28_4_ = auVar23._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar155 * local_1c0._4_4_;
    auVar37._0_4_ = fVar154 * local_1c0._0_4_;
    auVar37._8_4_ = fVar190 * local_1c0._8_4_;
    auVar37._12_4_ = fVar205 * local_1c0._12_4_;
    auVar37._16_4_ = fVar206 * local_1c0._16_4_;
    auVar37._20_4_ = fVar207 * local_1c0._20_4_;
    auVar37._24_4_ = fVar210 * local_1c0._24_4_;
    auVar37._28_4_ = auVar108._28_4_ + auVar24._28_4_;
    auVar24._4_4_ = auVar107._4_4_ * fVar238;
    auVar24._0_4_ = auVar107._0_4_ * fVar235;
    auVar24._8_4_ = auVar107._8_4_ * fVar241;
    auVar24._12_4_ = auVar107._12_4_ * fVar113;
    auVar24._16_4_ = auVar107._16_4_ * fVar115;
    auVar24._20_4_ = auVar107._20_4_ * fVar116;
    auVar24._24_4_ = auVar107._24_4_ * fVar117;
    auVar24._28_4_ = auVar150._28_4_ + auVar18._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar20 = vminps_avx(auVar25,auVar19);
    auVar105 = vmaxps_avx(auVar25,auVar19);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar26,auVar27);
    auVar105 = vmaxps_avx(auVar105,auVar20);
    auVar18 = vminps_avx(auVar28,auVar22);
    auVar20 = vmaxps_avx(auVar28,auVar22);
    auVar19 = vminps_avx(auVar29,auVar24);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar29,auVar24);
    auVar20 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar105,auVar20);
    auVar105 = vcmpps_avx(auVar19,local_320,2);
    auVar20 = vcmpps_avx(auVar20,local_340,5);
    auVar105 = vandps_avx(auVar20,auVar105);
    auVar20 = local_2a0 & auVar105;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar106,local_1e0);
      auVar21 = vsubps_avx(auVar107,auVar285);
      fVar155 = auVar20._0_4_ + auVar21._0_4_;
      fVar190 = auVar20._4_4_ + auVar21._4_4_;
      fVar205 = auVar20._8_4_ + auVar21._8_4_;
      fVar206 = auVar20._12_4_ + auVar21._12_4_;
      fVar207 = auVar20._16_4_ + auVar21._16_4_;
      fVar210 = auVar20._20_4_ + auVar21._20_4_;
      fVar235 = auVar20._24_4_ + auVar21._24_4_;
      auVar19 = vsubps_avx(local_200,auVar204);
      auVar22 = vsubps_avx(local_1c0,auVar316);
      fVar238 = auVar19._0_4_ + auVar22._0_4_;
      fVar241 = auVar19._4_4_ + auVar22._4_4_;
      fVar113 = auVar19._8_4_ + auVar22._8_4_;
      fVar115 = auVar19._12_4_ + auVar22._12_4_;
      fVar116 = auVar19._16_4_ + auVar22._16_4_;
      fVar117 = auVar19._20_4_ + auVar22._20_4_;
      fVar118 = auVar19._24_4_ + auVar22._24_4_;
      fVar154 = auVar22._28_4_;
      auVar38._4_4_ = auVar204._4_4_ * fVar190;
      auVar38._0_4_ = auVar204._0_4_ * fVar155;
      auVar38._8_4_ = auVar204._8_4_ * fVar205;
      auVar38._12_4_ = auVar204._12_4_ * fVar206;
      auVar38._16_4_ = auVar204._16_4_ * fVar207;
      auVar38._20_4_ = auVar204._20_4_ * fVar210;
      auVar38._24_4_ = auVar204._24_4_ * fVar235;
      auVar38._28_4_ = auVar204._28_4_;
      auVar39._4_4_ = local_1e0._4_4_ * fVar241;
      auVar39._0_4_ = local_1e0._0_4_ * fVar238;
      auVar39._8_4_ = local_1e0._8_4_ * fVar113;
      auVar39._12_4_ = local_1e0._12_4_ * fVar115;
      auVar39._16_4_ = local_1e0._16_4_ * fVar116;
      auVar39._20_4_ = local_1e0._20_4_ * fVar117;
      auVar39._24_4_ = local_1e0._24_4_ * fVar118;
      auVar39._28_4_ = local_1e0._28_4_;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar190 * fStack_23c;
      auVar40._0_4_ = fVar155 * local_240;
      auVar40._8_4_ = fVar205 * fStack_238;
      auVar40._12_4_ = fVar206 * fStack_234;
      auVar40._16_4_ = fVar207 * fStack_230;
      auVar40._20_4_ = fVar210 * fStack_22c;
      auVar40._24_4_ = fVar235 * fStack_228;
      auVar40._28_4_ = auVar204._28_4_;
      auVar41._4_4_ = fVar241 * fStack_21c;
      auVar41._0_4_ = fVar238 * local_220;
      auVar41._8_4_ = fVar113 * fStack_218;
      auVar41._12_4_ = fVar115 * fStack_214;
      auVar41._16_4_ = fVar116 * fStack_210;
      auVar41._20_4_ = fVar117 * fStack_20c;
      auVar41._24_4_ = fVar118 * fStack_208;
      auVar41._28_4_ = fVar154;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar190 * fStack_65c;
      auVar42._0_4_ = fVar155 * local_660;
      auVar42._8_4_ = fVar205 * fStack_658;
      auVar42._12_4_ = fVar206 * fStack_654;
      auVar42._16_4_ = fVar207 * fStack_650;
      auVar42._20_4_ = fVar210 * fStack_64c;
      auVar42._24_4_ = fVar235 * fStack_648;
      auVar42._28_4_ = fVar154;
      auVar43._4_4_ = fVar241 * fStack_6bc;
      auVar43._0_4_ = fVar238 * local_6c0;
      auVar43._8_4_ = fVar113 * fStack_6b8;
      auVar43._12_4_ = fVar115 * fStack_6b4;
      auVar43._16_4_ = fVar116 * fStack_6b0;
      auVar43._20_4_ = fVar117 * fStack_6ac;
      auVar43._24_4_ = fVar118 * fStack_6a8;
      auVar43._28_4_ = auVar18._28_4_;
      auVar108 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_200._4_4_ * fVar190;
      auVar44._0_4_ = local_200._0_4_ * fVar155;
      auVar44._8_4_ = local_200._8_4_ * fVar205;
      auVar44._12_4_ = local_200._12_4_ * fVar206;
      auVar44._16_4_ = local_200._16_4_ * fVar207;
      auVar44._20_4_ = local_200._20_4_ * fVar210;
      auVar44._24_4_ = local_200._24_4_ * fVar235;
      auVar44._28_4_ = auVar18._28_4_;
      auVar45._4_4_ = auVar106._4_4_ * fVar241;
      auVar45._0_4_ = auVar106._0_4_ * fVar238;
      auVar45._8_4_ = auVar106._8_4_ * fVar113;
      auVar45._12_4_ = auVar106._12_4_ * fVar115;
      auVar45._16_4_ = auVar106._16_4_ * fVar116;
      auVar45._20_4_ = auVar106._20_4_ * fVar117;
      uVar5 = auVar106._28_4_;
      auVar45._24_4_ = auVar106._24_4_ * fVar118;
      auVar45._28_4_ = uVar5;
      auVar106 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar316._4_4_ * fVar190;
      auVar46._0_4_ = auVar316._0_4_ * fVar155;
      auVar46._8_4_ = auVar316._8_4_ * fVar205;
      auVar46._12_4_ = auVar316._12_4_ * fVar206;
      auVar46._16_4_ = auVar316._16_4_ * fVar207;
      auVar46._20_4_ = auVar316._20_4_ * fVar210;
      auVar46._24_4_ = auVar316._24_4_ * fVar235;
      auVar46._28_4_ = uVar5;
      auVar47._4_4_ = auVar285._4_4_ * fVar241;
      auVar47._0_4_ = auVar285._0_4_ * fVar238;
      auVar47._8_4_ = auVar285._8_4_ * fVar113;
      auVar47._12_4_ = auVar285._12_4_ * fVar115;
      auVar47._16_4_ = auVar285._16_4_ * fVar116;
      auVar47._20_4_ = auVar285._20_4_ * fVar117;
      auVar47._24_4_ = auVar285._24_4_ * fVar118;
      auVar47._28_4_ = auVar285._28_4_;
      auVar150 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar190 * fStack_27c;
      auVar48._0_4_ = fVar155 * local_280;
      auVar48._8_4_ = fVar205 * fStack_278;
      auVar48._12_4_ = fVar206 * fStack_274;
      auVar48._16_4_ = fVar207 * fStack_270;
      auVar48._20_4_ = fVar210 * fStack_26c;
      auVar48._24_4_ = fVar235 * fStack_268;
      auVar48._28_4_ = uVar5;
      auVar49._4_4_ = fVar241 * fStack_25c;
      auVar49._0_4_ = fVar238 * local_260;
      auVar49._8_4_ = fVar113 * fStack_258;
      auVar49._12_4_ = fVar115 * fStack_254;
      auVar49._16_4_ = fVar116 * fStack_250;
      auVar49._20_4_ = fVar117 * fStack_24c;
      auVar49._24_4_ = fVar118 * fStack_248;
      auVar49._28_4_ = auVar316._28_4_;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar190 * auVar23._4_4_;
      auVar50._0_4_ = fVar155 * auVar23._0_4_;
      auVar50._8_4_ = fVar205 * auVar23._8_4_;
      auVar50._12_4_ = fVar206 * auVar23._12_4_;
      auVar50._16_4_ = fVar207 * auVar23._16_4_;
      auVar50._20_4_ = fVar210 * auVar23._20_4_;
      auVar50._24_4_ = fVar235 * auVar23._24_4_;
      auVar50._28_4_ = auVar316._28_4_;
      auVar51._4_4_ = fStack_69c * fVar241;
      auVar51._0_4_ = local_6a0 * fVar238;
      auVar51._8_4_ = fStack_698 * fVar113;
      auVar51._12_4_ = fStack_694 * fVar115;
      auVar51._16_4_ = fStack_690 * fVar116;
      auVar51._20_4_ = fStack_68c * fVar117;
      auVar51._24_4_ = fStack_688 * fVar118;
      auVar51._28_4_ = local_200._28_4_;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = local_1c0._4_4_ * fVar190;
      auVar52._0_4_ = local_1c0._0_4_ * fVar155;
      auVar52._8_4_ = local_1c0._8_4_ * fVar205;
      auVar52._12_4_ = local_1c0._12_4_ * fVar206;
      auVar52._16_4_ = local_1c0._16_4_ * fVar207;
      auVar52._20_4_ = local_1c0._20_4_ * fVar210;
      auVar52._24_4_ = local_1c0._24_4_ * fVar235;
      auVar52._28_4_ = auVar20._28_4_ + auVar21._28_4_;
      auVar53._4_4_ = auVar107._4_4_ * fVar241;
      auVar53._0_4_ = auVar107._0_4_ * fVar238;
      auVar53._8_4_ = auVar107._8_4_ * fVar113;
      auVar53._12_4_ = auVar107._12_4_ * fVar115;
      auVar53._16_4_ = auVar107._16_4_ * fVar116;
      auVar53._20_4_ = auVar107._20_4_ * fVar117;
      auVar53._24_4_ = auVar107._24_4_ * fVar118;
      auVar53._28_4_ = auVar19._28_4_ + fVar154;
      auVar107 = vsubps_avx(auVar52,auVar53);
      auVar21 = vminps_avx(auVar22,auVar24);
      auVar20 = vmaxps_avx(auVar22,auVar24);
      auVar18 = vminps_avx(auVar108,auVar106);
      auVar18 = vminps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar108,auVar106);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar19 = vminps_avx(auVar150,auVar25);
      auVar21 = vmaxps_avx(auVar150,auVar25);
      auVar106 = vminps_avx(auVar23,auVar107);
      auVar19 = vminps_avx(auVar19,auVar106);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar23,auVar107);
      auVar21 = vmaxps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vcmpps_avx(auVar19,local_320,2);
      auVar21 = vcmpps_avx(auVar21,local_340,5);
      auVar20 = vandps_avx(auVar21,auVar20);
      auVar105 = vandps_avx(local_2a0,auVar105);
      auVar21 = auVar105 & auVar20;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar20,auVar105);
        uVar71 = vmovmskps_avx(auVar105);
        if (uVar71 != 0) {
          uVar69 = (ulong)uVar73;
          auStack_470[uVar69] = uVar71 & 0xff;
          uVar6 = vmovlps_avx(auVar121);
          *(undefined8 *)(afStack_300 + uVar69 * 2) = uVar6;
          uVar67 = vmovlps_avx(auVar76);
          auStack_1a0[uVar69] = uVar67;
          uVar73 = uVar73 + 1;
        }
      }
    }
    if (uVar73 != 0) {
      do {
        uVar69 = (ulong)(uVar73 - 1);
        uVar71 = auStack_470[uVar69];
        fVar154 = afStack_300[uVar69 * 2];
        fVar155 = afStack_300[uVar69 * 2 + 1];
        auVar332._8_8_ = 0;
        auVar332._0_8_ = auStack_1a0[uVar69];
        auVar338 = ZEXT1664(auVar332);
        uVar67 = 0;
        if (uVar71 != 0) {
          for (; (uVar71 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
          }
        }
        uVar71 = uVar71 - 1 & uVar71;
        auStack_470[uVar69] = uVar71;
        if (uVar71 == 0) {
          uVar73 = uVar73 - 1;
        }
        fVar205 = (float)(uVar67 + 1) * 0.14285715;
        fVar190 = (1.0 - (float)uVar67 * 0.14285715) * fVar154 +
                  fVar155 * (float)uVar67 * 0.14285715;
        fVar154 = (1.0 - fVar205) * fVar154 + fVar155 * fVar205;
        fVar155 = fVar154 - fVar190;
        if (0.16666667 <= fVar155) {
          auVar93 = vinsertps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar154),0x10);
          auVar367 = ZEXT1664(auVar93);
          goto LAB_00f5b18c;
        }
        auVar93 = vshufps_avx(auVar332,auVar332,0x50);
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = 0x3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar217 = vsubps_avx(auVar132,auVar93);
        fVar205 = auVar93._0_4_;
        fVar206 = auVar93._4_4_;
        fVar207 = auVar93._8_4_;
        fVar210 = auVar93._12_4_;
        fVar235 = auVar217._0_4_;
        fVar238 = auVar217._4_4_;
        fVar241 = auVar217._8_4_;
        fVar113 = auVar217._12_4_;
        auVar170._0_4_ = fVar205 * auVar300._0_4_ + fVar235 * auVar360._0_4_;
        auVar170._4_4_ = fVar206 * auVar300._4_4_ + fVar238 * auVar360._4_4_;
        auVar170._8_4_ = fVar207 * auVar300._0_4_ + fVar241 * auVar360._0_4_;
        auVar170._12_4_ = fVar210 * auVar300._4_4_ + fVar113 * auVar360._4_4_;
        auVar223._0_4_ = fVar205 * auVar311._0_4_ + fVar235 * fVar258;
        auVar223._4_4_ = fVar206 * auVar311._4_4_ + fVar238 * fVar211;
        auVar223._8_4_ = fVar207 * auVar311._0_4_ + fVar241 * fVar258;
        auVar223._12_4_ = fVar210 * auVar311._4_4_ + fVar113 * fVar211;
        auVar249._0_4_ = fVar205 * auVar325._0_4_ + auVar357._0_4_ * fVar235;
        auVar249._4_4_ = fVar206 * auVar325._4_4_ + auVar357._4_4_ * fVar238;
        auVar249._8_4_ = fVar207 * auVar325._0_4_ + auVar357._0_4_ * fVar241;
        auVar249._12_4_ = fVar210 * auVar325._4_4_ + auVar357._4_4_ * fVar113;
        auVar90._0_4_ = auVar88._0_4_ * fVar205 + auVar131._0_4_ * fVar235;
        auVar90._4_4_ = auVar88._4_4_ * fVar206 + auVar131._4_4_ * fVar238;
        auVar90._8_4_ = auVar88._0_4_ * fVar207 + auVar131._0_4_ * fVar241;
        auVar90._12_4_ = auVar88._4_4_ * fVar210 + auVar131._4_4_ * fVar113;
        auVar151._16_16_ = auVar170;
        auVar151._0_16_ = auVar170;
        auVar187._16_16_ = auVar223;
        auVar187._0_16_ = auVar223;
        auVar234._16_16_ = auVar249;
        auVar234._0_16_ = auVar249;
        auVar105 = ZEXT2032(CONCAT416(fVar154,ZEXT416((uint)fVar190)));
        auVar105 = vshufps_avx(auVar105,auVar105,0);
        auVar20 = vsubps_avx(auVar187,auVar151);
        fVar205 = auVar105._0_4_;
        fVar206 = auVar105._4_4_;
        fVar207 = auVar105._8_4_;
        fVar210 = auVar105._12_4_;
        fVar235 = auVar105._16_4_;
        fVar238 = auVar105._20_4_;
        fVar241 = auVar105._24_4_;
        auVar152._0_4_ = auVar170._0_4_ + auVar20._0_4_ * fVar205;
        auVar152._4_4_ = auVar170._4_4_ + auVar20._4_4_ * fVar206;
        auVar152._8_4_ = auVar170._8_4_ + auVar20._8_4_ * fVar207;
        auVar152._12_4_ = auVar170._12_4_ + auVar20._12_4_ * fVar210;
        auVar152._16_4_ = auVar170._0_4_ + auVar20._16_4_ * fVar235;
        auVar152._20_4_ = auVar170._4_4_ + auVar20._20_4_ * fVar238;
        auVar152._24_4_ = auVar170._8_4_ + auVar20._24_4_ * fVar241;
        auVar152._28_4_ = auVar170._12_4_ + auVar20._28_4_;
        auVar105 = vsubps_avx(auVar234,auVar187);
        auVar188._0_4_ = auVar223._0_4_ + auVar105._0_4_ * fVar205;
        auVar188._4_4_ = auVar223._4_4_ + auVar105._4_4_ * fVar206;
        auVar188._8_4_ = auVar223._8_4_ + auVar105._8_4_ * fVar207;
        auVar188._12_4_ = auVar223._12_4_ + auVar105._12_4_ * fVar210;
        auVar188._16_4_ = auVar223._0_4_ + auVar105._16_4_ * fVar235;
        auVar188._20_4_ = auVar223._4_4_ + auVar105._20_4_ * fVar238;
        auVar188._24_4_ = auVar223._8_4_ + auVar105._24_4_ * fVar241;
        auVar188._28_4_ = auVar223._12_4_ + auVar105._28_4_;
        auVar93 = vsubps_avx(auVar90,auVar249);
        auVar109._0_4_ = auVar249._0_4_ + auVar93._0_4_ * fVar205;
        auVar109._4_4_ = auVar249._4_4_ + auVar93._4_4_ * fVar206;
        auVar109._8_4_ = auVar249._8_4_ + auVar93._8_4_ * fVar207;
        auVar109._12_4_ = auVar249._12_4_ + auVar93._12_4_ * fVar210;
        auVar109._16_4_ = auVar249._0_4_ + auVar93._0_4_ * fVar235;
        auVar109._20_4_ = auVar249._4_4_ + auVar93._4_4_ * fVar238;
        auVar109._24_4_ = auVar249._8_4_ + auVar93._8_4_ * fVar241;
        auVar109._28_4_ = auVar249._12_4_ + auVar93._12_4_;
        auVar105 = vsubps_avx(auVar188,auVar152);
        auVar153._0_4_ = auVar152._0_4_ + fVar205 * auVar105._0_4_;
        auVar153._4_4_ = auVar152._4_4_ + fVar206 * auVar105._4_4_;
        auVar153._8_4_ = auVar152._8_4_ + fVar207 * auVar105._8_4_;
        auVar153._12_4_ = auVar152._12_4_ + fVar210 * auVar105._12_4_;
        auVar153._16_4_ = auVar152._16_4_ + fVar235 * auVar105._16_4_;
        auVar153._20_4_ = auVar152._20_4_ + fVar238 * auVar105._20_4_;
        auVar153._24_4_ = auVar152._24_4_ + fVar241 * auVar105._24_4_;
        auVar153._28_4_ = auVar152._28_4_ + auVar105._28_4_;
        auVar105 = vsubps_avx(auVar109,auVar188);
        auVar110._0_4_ = auVar188._0_4_ + fVar205 * auVar105._0_4_;
        auVar110._4_4_ = auVar188._4_4_ + fVar206 * auVar105._4_4_;
        auVar110._8_4_ = auVar188._8_4_ + fVar207 * auVar105._8_4_;
        auVar110._12_4_ = auVar188._12_4_ + fVar210 * auVar105._12_4_;
        auVar110._16_4_ = auVar188._16_4_ + fVar235 * auVar105._16_4_;
        auVar110._20_4_ = auVar188._20_4_ + fVar238 * auVar105._20_4_;
        auVar110._24_4_ = auVar188._24_4_ + fVar241 * auVar105._24_4_;
        auVar110._28_4_ = auVar188._28_4_ + auVar105._28_4_;
        auVar105 = vsubps_avx(auVar110,auVar153);
        auVar267._0_4_ = auVar153._0_4_ + fVar205 * auVar105._0_4_;
        auVar267._4_4_ = auVar153._4_4_ + fVar206 * auVar105._4_4_;
        auVar267._8_4_ = auVar153._8_4_ + fVar207 * auVar105._8_4_;
        auVar267._12_4_ = auVar153._12_4_ + fVar210 * auVar105._12_4_;
        auVar272._16_4_ = auVar153._16_4_ + fVar235 * auVar105._16_4_;
        auVar272._0_16_ = auVar267;
        auVar272._20_4_ = auVar153._20_4_ + fVar238 * auVar105._20_4_;
        auVar272._24_4_ = auVar153._24_4_ + fVar241 * auVar105._24_4_;
        auVar272._28_4_ = auVar153._28_4_ + auVar188._28_4_;
        auVar273 = auVar272._16_16_;
        auVar134 = vshufps_avx(ZEXT416((uint)(fVar155 * 0.33333334)),
                               ZEXT416((uint)(fVar155 * 0.33333334)),0);
        auVar224._0_4_ = auVar267._0_4_ + auVar134._0_4_ * auVar105._0_4_ * 3.0;
        auVar224._4_4_ = auVar267._4_4_ + auVar134._4_4_ * auVar105._4_4_ * 3.0;
        auVar224._8_4_ = auVar267._8_4_ + auVar134._8_4_ * auVar105._8_4_ * 3.0;
        auVar224._12_4_ = auVar267._12_4_ + auVar134._12_4_ * auVar105._12_4_ * 3.0;
        auVar186 = vshufpd_avx(auVar267,auVar267,3);
        auVar146 = vshufpd_avx(auVar273,auVar273,3);
        auVar93 = vsubps_avx(auVar186,auVar267);
        auVar217 = vsubps_avx(auVar146,auVar273);
        auVar91._0_4_ = auVar93._0_4_ + auVar217._0_4_;
        auVar91._4_4_ = auVar93._4_4_ + auVar217._4_4_;
        auVar91._8_4_ = auVar93._8_4_ + auVar217._8_4_;
        auVar91._12_4_ = auVar93._12_4_ + auVar217._12_4_;
        auVar93 = vmovshdup_avx(auVar267);
        auVar217 = vmovshdup_avx(auVar224);
        auVar172 = vshufps_avx(auVar91,auVar91,0);
        auVar135 = vshufps_avx(auVar91,auVar91,0x55);
        fVar205 = auVar135._0_4_;
        fVar206 = auVar135._4_4_;
        fVar207 = auVar135._8_4_;
        fVar210 = auVar135._12_4_;
        fVar235 = auVar172._0_4_;
        fVar238 = auVar172._4_4_;
        fVar241 = auVar172._8_4_;
        fVar113 = auVar172._12_4_;
        auVar92._0_4_ = fVar235 * auVar267._0_4_ + auVar93._0_4_ * fVar205;
        auVar92._4_4_ = fVar238 * auVar267._4_4_ + auVar93._4_4_ * fVar206;
        auVar92._8_4_ = fVar241 * auVar267._8_4_ + auVar93._8_4_ * fVar207;
        auVar92._12_4_ = fVar113 * auVar267._12_4_ + auVar93._12_4_ * fVar210;
        auVar333._0_4_ = fVar235 * auVar224._0_4_ + auVar217._0_4_ * fVar205;
        auVar333._4_4_ = fVar238 * auVar224._4_4_ + auVar217._4_4_ * fVar206;
        auVar333._8_4_ = fVar241 * auVar224._8_4_ + auVar217._8_4_ * fVar207;
        auVar333._12_4_ = fVar113 * auVar224._12_4_ + auVar217._12_4_ * fVar210;
        auVar217 = vshufps_avx(auVar92,auVar92,0xe8);
        auVar172 = vshufps_avx(auVar333,auVar333,0xe8);
        auVar93 = vcmpps_avx(auVar217,auVar172,1);
        uVar71 = vextractps_avx(auVar93,0);
        auVar135 = auVar333;
        if ((uVar71 & 1) == 0) {
          auVar135 = auVar92;
        }
        auVar133._0_4_ = auVar134._0_4_ * auVar105._16_4_ * 3.0;
        auVar133._4_4_ = auVar134._4_4_ * auVar105._20_4_ * 3.0;
        auVar133._8_4_ = auVar134._8_4_ * auVar105._24_4_ * 3.0;
        auVar133._12_4_ = auVar134._12_4_ * 0.0;
        auVar75 = vsubps_avx(auVar273,auVar133);
        auVar134 = vmovshdup_avx(auVar75);
        auVar273 = vmovshdup_avx(auVar273);
        fVar115 = auVar75._0_4_;
        fVar116 = auVar75._4_4_;
        auVar250._0_4_ = fVar115 * fVar235 + auVar134._0_4_ * fVar205;
        auVar250._4_4_ = fVar116 * fVar238 + auVar134._4_4_ * fVar206;
        auVar250._8_4_ = auVar75._8_4_ * fVar241 + auVar134._8_4_ * fVar207;
        auVar250._12_4_ = auVar75._12_4_ * fVar113 + auVar134._12_4_ * fVar210;
        auVar366._0_4_ = fVar235 * auVar272._16_4_ + auVar273._0_4_ * fVar205;
        auVar366._4_4_ = fVar238 * auVar272._20_4_ + auVar273._4_4_ * fVar206;
        auVar366._8_4_ = fVar241 * auVar272._24_4_ + auVar273._8_4_ * fVar207;
        auVar366._12_4_ = fVar113 * auVar272._28_4_ + auVar273._12_4_ * fVar210;
        auVar273 = vshufps_avx(auVar250,auVar250,0xe8);
        auVar74 = vshufps_avx(auVar366,auVar366,0xe8);
        auVar134 = vcmpps_avx(auVar273,auVar74,1);
        uVar71 = vextractps_avx(auVar134,0);
        auVar76 = auVar366;
        if ((uVar71 & 1) == 0) {
          auVar76 = auVar250;
        }
        auVar135 = vmaxss_avx(auVar76,auVar135);
        auVar217 = vminps_avx(auVar217,auVar172);
        auVar172 = vminps_avx(auVar273,auVar74);
        auVar172 = vminps_avx(auVar217,auVar172);
        auVar93 = vshufps_avx(auVar93,auVar93,0x55);
        auVar93 = vblendps_avx(auVar93,auVar134,2);
        auVar134 = vpslld_avx(auVar93,0x1f);
        auVar93 = vshufpd_avx(auVar333,auVar333,1);
        auVar93 = vinsertps_avx(auVar93,auVar366,0x9c);
        auVar217 = vshufpd_avx(auVar92,auVar92,1);
        auVar217 = vinsertps_avx(auVar217,auVar250,0x9c);
        auVar93 = vblendvps_avx(auVar217,auVar93,auVar134);
        auVar217 = vmovshdup_avx(auVar93);
        auVar93 = vmaxss_avx(auVar217,auVar93);
        fVar207 = auVar172._0_4_;
        auVar217 = vmovshdup_avx(auVar172);
        fVar206 = auVar93._0_4_;
        fVar210 = auVar217._0_4_;
        fVar205 = auVar135._0_4_;
        if ((0.0001 <= fVar207) || (fVar206 <= -0.0001)) {
          if ((fVar210 < 0.0001 && -0.0001 < fVar205) || (fVar207 < 0.0001 && -0.0001 < fVar205))
          goto LAB_00f5bb8d;
          auVar134 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar93,1);
          auVar217 = vcmpps_avx(auVar217,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar217 = vandps_avx(auVar217,auVar134);
          if ((auVar217 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00f5bb8d;
        }
        else {
LAB_00f5bb8d:
          auVar134 = vcmpps_avx(auVar172,_DAT_01f7aa10,1);
          auVar217 = vcmpss_avx(auVar135,ZEXT416(0) << 0x20,1);
          auVar171._8_4_ = 0x3f800000;
          auVar171._0_8_ = 0x3f8000003f800000;
          auVar171._12_4_ = 0x3f800000;
          auVar225._8_4_ = 0xbf800000;
          auVar225._0_8_ = 0xbf800000bf800000;
          auVar225._12_4_ = 0xbf800000;
          auVar217 = vblendvps_avx(auVar171,auVar225,auVar217);
          auVar134 = vblendvps_avx(auVar171,auVar225,auVar134);
          auVar172 = vcmpss_avx(auVar134,auVar217,4);
          auVar172 = vpshufd_avx(ZEXT416(auVar172._0_4_ & 1),0x50);
          auVar172 = vpslld_avx(auVar172,0x1f);
          auVar172 = vpsrad_avx(auVar172,0x1f);
          auVar172 = vpandn_avx(auVar172,_DAT_01fafeb0);
          auVar135 = vmovshdup_avx(auVar134);
          fVar235 = auVar135._0_4_;
          if ((auVar134._0_4_ != fVar235) || (NAN(auVar134._0_4_) || NAN(fVar235))) {
            if ((fVar210 != fVar207) || (NAN(fVar210) || NAN(fVar207))) {
              fVar207 = -fVar207 / (fVar210 - fVar207);
              auVar134 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar207) * 0.0 + fVar207)));
            }
            else {
              auVar134 = ZEXT816(0x3f80000000000000);
              if ((fVar207 != 0.0) || (NAN(fVar207))) {
                auVar134 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar273 = vcmpps_avx(auVar172,auVar134,1);
            auVar135 = vblendps_avx(auVar172,auVar134,2);
            auVar134 = vblendps_avx(auVar134,auVar172,2);
            auVar172 = vblendvps_avx(auVar134,auVar135,auVar273);
          }
          auVar93 = vcmpss_avx(auVar93,ZEXT416(0) << 0x20,1);
          auVar173._8_4_ = 0x3f800000;
          auVar173._0_8_ = 0x3f8000003f800000;
          auVar173._12_4_ = 0x3f800000;
          auVar226._8_4_ = 0xbf800000;
          auVar226._0_8_ = 0xbf800000bf800000;
          auVar226._12_4_ = 0xbf800000;
          auVar93 = vblendvps_avx(auVar173,auVar226,auVar93);
          fVar207 = auVar93._0_4_;
          if ((auVar217._0_4_ != fVar207) || (NAN(auVar217._0_4_) || NAN(fVar207))) {
            if ((fVar206 != fVar205) || (NAN(fVar206) || NAN(fVar205))) {
              fVar205 = -fVar205 / (fVar206 - fVar205);
              auVar93 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
            }
            else {
              auVar93 = ZEXT816(0x3f80000000000000);
              if ((fVar205 != 0.0) || (NAN(fVar205))) {
                auVar93 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar134 = vcmpps_avx(auVar172,auVar93,1);
            auVar217 = vblendps_avx(auVar172,auVar93,2);
            auVar93 = vblendps_avx(auVar93,auVar172,2);
            auVar172 = vblendvps_avx(auVar93,auVar217,auVar134);
          }
          if ((fVar235 != fVar207) || (NAN(fVar235) || NAN(fVar207))) {
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar93 = vcmpps_avx(auVar172,auVar94,1);
            auVar217 = vinsertps_avx(auVar172,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar174._4_12_ = auVar172._4_12_;
            auVar174._0_4_ = 0x3f800000;
            auVar172 = vblendvps_avx(auVar174,auVar217,auVar93);
          }
          auVar93 = vcmpps_avx(auVar172,_DAT_01f7b6f0,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar172._4_12_;
          auVar217 = vinsertps_avx(auVar172,ZEXT416(0x3f800000),0x10);
          auVar93 = vblendvps_avx(auVar217,auVar56 << 0x20,auVar93);
          auVar217 = vmovshdup_avx(auVar93);
          if (auVar93._0_4_ <= auVar217._0_4_) {
            auVar95._0_4_ = auVar93._0_4_ + -0.1;
            auVar95._4_4_ = auVar93._4_4_ + 0.1;
            auVar95._8_4_ = auVar93._8_4_ + 0.0;
            auVar95._12_4_ = auVar93._12_4_ + 0.0;
            auVar134 = vshufpd_avx(auVar224,auVar224,3);
            auVar268._8_8_ = 0x3f80000000000000;
            auVar268._0_8_ = 0x3f80000000000000;
            auVar93 = vcmpps_avx(auVar95,auVar268,1);
            auVar54._12_4_ = 0;
            auVar54._0_12_ = auVar95._4_12_;
            auVar217 = vinsertps_avx(auVar95,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar93 = vblendvps_avx(auVar217,auVar54 << 0x20,auVar93);
            auVar217 = vshufpd_avx(auVar75,auVar75,3);
            auVar172 = vshufps_avx(auVar93,auVar93,0x50);
            auVar269._8_4_ = 0x3f800000;
            auVar269._0_8_ = 0x3f8000003f800000;
            auVar269._12_4_ = 0x3f800000;
            auVar135 = vsubps_avx(auVar269,auVar172);
            local_5e0._0_4_ = auVar186._0_4_;
            local_5e0._4_4_ = auVar186._4_4_;
            fStack_5d8 = auVar186._8_4_;
            fStack_5d4 = auVar186._12_4_;
            fVar205 = auVar172._0_4_;
            fVar206 = auVar172._4_4_;
            fVar207 = auVar172._8_4_;
            fVar210 = auVar172._12_4_;
            local_680 = auVar146._0_4_;
            fStack_67c = auVar146._4_4_;
            fStack_678 = auVar146._8_4_;
            fStack_674 = auVar146._12_4_;
            fVar235 = auVar135._0_4_;
            fVar238 = auVar135._4_4_;
            fVar241 = auVar135._8_4_;
            fVar113 = auVar135._12_4_;
            auVar96._0_4_ = fVar205 * (float)local_5e0._0_4_ + fVar235 * auVar267._0_4_;
            auVar96._4_4_ = fVar206 * (float)local_5e0._4_4_ + fVar238 * auVar267._4_4_;
            auVar96._8_4_ = fVar207 * fStack_5d8 + fVar241 * auVar267._0_4_;
            auVar96._12_4_ = fVar210 * fStack_5d4 + fVar113 * auVar267._4_4_;
            auVar251._0_4_ = auVar134._0_4_ * fVar205 + fVar235 * auVar224._0_4_;
            auVar251._4_4_ = auVar134._4_4_ * fVar206 + fVar238 * auVar224._4_4_;
            auVar251._8_4_ = auVar134._8_4_ * fVar207 + fVar241 * auVar224._0_4_;
            auVar251._12_4_ = auVar134._12_4_ * fVar210 + fVar113 * auVar224._4_4_;
            auVar283._0_4_ = auVar217._0_4_ * fVar205 + fVar235 * fVar115;
            auVar283._4_4_ = auVar217._4_4_ * fVar206 + fVar238 * fVar116;
            auVar283._8_4_ = auVar217._8_4_ * fVar207 + fVar241 * fVar115;
            auVar283._12_4_ = auVar217._12_4_ * fVar210 + fVar113 * fVar116;
            auVar326._0_4_ = fVar205 * local_680 + fVar235 * auVar272._16_4_;
            auVar326._4_4_ = fVar206 * fStack_67c + fVar238 * auVar272._20_4_;
            auVar326._8_4_ = fVar207 * fStack_678 + fVar241 * auVar272._16_4_;
            auVar326._12_4_ = fVar210 * fStack_674 + fVar113 * auVar272._20_4_;
            auVar146 = vsubps_avx(auVar269,auVar93);
            auVar217 = vmovshdup_avx(auVar332);
            auVar186 = vmovsldup_avx(auVar332);
            auVar270._0_4_ = auVar146._0_4_ * auVar186._0_4_ + auVar93._0_4_ * auVar217._0_4_;
            auVar270._4_4_ = auVar146._4_4_ * auVar186._4_4_ + auVar93._4_4_ * auVar217._4_4_;
            auVar270._8_4_ = auVar146._8_4_ * auVar186._8_4_ + auVar93._8_4_ * auVar217._8_4_;
            auVar270._12_4_ = auVar146._12_4_ * auVar186._12_4_ + auVar93._12_4_ * auVar217._12_4_;
            auVar75 = vmovshdup_avx(auVar270);
            auVar93 = vsubps_avx(auVar251,auVar96);
            auVar175._0_4_ = auVar93._0_4_ * 3.0;
            auVar175._4_4_ = auVar93._4_4_ * 3.0;
            auVar175._8_4_ = auVar93._8_4_ * 3.0;
            auVar175._12_4_ = auVar93._12_4_ * 3.0;
            auVar93 = vsubps_avx(auVar283,auVar251);
            auVar201._0_4_ = auVar93._0_4_ * 3.0;
            auVar201._4_4_ = auVar93._4_4_ * 3.0;
            auVar201._8_4_ = auVar93._8_4_ * 3.0;
            auVar201._12_4_ = auVar93._12_4_ * 3.0;
            auVar93 = vsubps_avx(auVar326,auVar283);
            auVar301._0_4_ = auVar93._0_4_ * 3.0;
            auVar301._4_4_ = auVar93._4_4_ * 3.0;
            auVar301._8_4_ = auVar93._8_4_ * 3.0;
            auVar301._12_4_ = auVar93._12_4_ * 3.0;
            auVar217 = vminps_avx(auVar201,auVar301);
            auVar93 = vmaxps_avx(auVar201,auVar301);
            auVar217 = vminps_avx(auVar175,auVar217);
            auVar93 = vmaxps_avx(auVar175,auVar93);
            auVar186 = vshufpd_avx(auVar217,auVar217,3);
            auVar146 = vshufpd_avx(auVar93,auVar93,3);
            auVar217 = vminps_avx(auVar217,auVar186);
            auVar93 = vmaxps_avx(auVar93,auVar146);
            auVar186 = vshufps_avx(ZEXT416((uint)(1.0 / fVar155)),ZEXT416((uint)(1.0 / fVar155)),0);
            auVar302._0_4_ = auVar186._0_4_ * auVar217._0_4_;
            auVar302._4_4_ = auVar186._4_4_ * auVar217._4_4_;
            auVar302._8_4_ = auVar186._8_4_ * auVar217._8_4_;
            auVar302._12_4_ = auVar186._12_4_ * auVar217._12_4_;
            auVar312._0_4_ = auVar186._0_4_ * auVar93._0_4_;
            auVar312._4_4_ = auVar186._4_4_ * auVar93._4_4_;
            auVar312._8_4_ = auVar186._8_4_ * auVar93._8_4_;
            auVar312._12_4_ = auVar186._12_4_ * auVar93._12_4_;
            auVar135 = ZEXT416((uint)(1.0 / (auVar75._0_4_ - auVar270._0_4_)));
            auVar93 = vshufpd_avx(auVar96,auVar96,3);
            auVar217 = vshufpd_avx(auVar251,auVar251,3);
            auVar186 = vshufpd_avx(auVar283,auVar283,3);
            auVar146 = vshufpd_avx(auVar326,auVar326,3);
            auVar93 = vsubps_avx(auVar93,auVar96);
            auVar134 = vsubps_avx(auVar217,auVar251);
            auVar172 = vsubps_avx(auVar186,auVar283);
            auVar146 = vsubps_avx(auVar146,auVar326);
            auVar217 = vminps_avx(auVar93,auVar134);
            auVar93 = vmaxps_avx(auVar93,auVar134);
            auVar186 = vminps_avx(auVar172,auVar146);
            auVar186 = vminps_avx(auVar217,auVar186);
            auVar217 = vmaxps_avx(auVar172,auVar146);
            auVar93 = vmaxps_avx(auVar93,auVar217);
            auVar217 = vshufps_avx(auVar135,auVar135,0);
            auVar358._0_4_ = auVar217._0_4_ * auVar186._0_4_;
            auVar358._4_4_ = auVar217._4_4_ * auVar186._4_4_;
            auVar358._8_4_ = auVar217._8_4_ * auVar186._8_4_;
            auVar358._12_4_ = auVar217._12_4_ * auVar186._12_4_;
            auVar362._0_4_ = auVar217._0_4_ * auVar93._0_4_;
            auVar362._4_4_ = auVar217._4_4_ * auVar93._4_4_;
            auVar362._8_4_ = auVar217._8_4_ * auVar93._8_4_;
            auVar362._12_4_ = auVar217._12_4_ * auVar93._12_4_;
            auVar93 = vmovsldup_avx(auVar270);
            auVar327._4_12_ = auVar93._4_12_;
            auVar327._0_4_ = fVar190;
            auVar334._4_12_ = auVar270._4_12_;
            auVar334._0_4_ = fVar154;
            auVar202._0_4_ = (fVar190 + fVar154) * 0.5;
            auVar202._4_4_ = (auVar93._4_4_ + auVar270._4_4_) * 0.5;
            auVar202._8_4_ = (auVar93._8_4_ + auVar270._8_4_) * 0.5;
            auVar202._12_4_ = (auVar93._12_4_ + auVar270._12_4_) * 0.5;
            auVar93 = vshufps_avx(auVar202,auVar202,0);
            fVar205 = auVar93._0_4_;
            fVar206 = auVar93._4_4_;
            fVar207 = auVar93._8_4_;
            fVar210 = auVar93._12_4_;
            local_6d0._0_4_ = auVar294._0_4_;
            local_6d0._4_4_ = auVar294._4_4_;
            fStack_6c8 = auVar294._8_4_;
            fStack_6c4 = auVar294._12_4_;
            auVar136._0_4_ = fVar205 * (float)local_350._0_4_ + (float)local_6d0._0_4_;
            auVar136._4_4_ = fVar206 * (float)local_350._4_4_ + (float)local_6d0._4_4_;
            auVar136._8_4_ = fVar207 * fStack_348 + fStack_6c8;
            auVar136._12_4_ = fVar210 * fStack_344 + fStack_6c4;
            local_6e0._0_4_ = auVar15._0_4_;
            local_6e0._4_4_ = auVar15._4_4_;
            fStack_6d8 = auVar15._8_4_;
            fStack_6d4 = auVar15._12_4_;
            auVar176._0_4_ = fVar205 * (float)local_360._0_4_ + (float)local_6e0._0_4_;
            auVar176._4_4_ = fVar206 * (float)local_360._4_4_ + (float)local_6e0._4_4_;
            auVar176._8_4_ = fVar207 * fStack_358 + fStack_6d8;
            auVar176._12_4_ = fVar210 * fStack_354 + fStack_6d4;
            local_5b0 = auVar16._0_4_;
            fStack_5ac = auVar16._4_4_;
            fStack_5a8 = auVar16._8_4_;
            fStack_5a4 = auVar16._12_4_;
            auVar252._0_4_ = fVar205 * (float)local_370._0_4_ + local_5b0;
            auVar252._4_4_ = fVar206 * (float)local_370._4_4_ + fStack_5ac;
            auVar252._8_4_ = fVar207 * fStack_368 + fStack_5a8;
            auVar252._12_4_ = fVar210 * fStack_364 + fStack_5a4;
            auVar93 = vsubps_avx(auVar176,auVar136);
            auVar137._0_4_ = auVar136._0_4_ + fVar205 * auVar93._0_4_;
            auVar137._4_4_ = auVar136._4_4_ + fVar206 * auVar93._4_4_;
            auVar137._8_4_ = auVar136._8_4_ + fVar207 * auVar93._8_4_;
            auVar137._12_4_ = auVar136._12_4_ + fVar210 * auVar93._12_4_;
            auVar93 = vsubps_avx(auVar252,auVar176);
            auVar177._0_4_ = auVar176._0_4_ + fVar205 * auVar93._0_4_;
            auVar177._4_4_ = auVar176._4_4_ + fVar206 * auVar93._4_4_;
            auVar177._8_4_ = auVar176._8_4_ + fVar207 * auVar93._8_4_;
            auVar177._12_4_ = auVar176._12_4_ + fVar210 * auVar93._12_4_;
            auVar93 = vsubps_avx(auVar177,auVar137);
            fVar205 = auVar137._0_4_ + fVar205 * auVar93._0_4_;
            fVar206 = auVar137._4_4_ + fVar206 * auVar93._4_4_;
            auVar97._0_8_ = CONCAT44(fVar206,fVar205);
            auVar97._8_4_ = auVar137._8_4_ + fVar207 * auVar93._8_4_;
            auVar97._12_4_ = auVar137._12_4_ + fVar210 * auVar93._12_4_;
            fVar207 = auVar93._0_4_ * 3.0;
            fVar210 = auVar93._4_4_ * 3.0;
            auVar138._0_8_ = CONCAT44(fVar210,fVar207);
            auVar138._8_4_ = auVar93._8_4_ * 3.0;
            auVar138._12_4_ = auVar93._12_4_ * 3.0;
            auVar178._8_8_ = auVar97._0_8_;
            auVar178._0_8_ = auVar97._0_8_;
            auVar93 = vshufpd_avx(auVar97,auVar97,3);
            auVar217 = vshufps_avx(auVar202,auVar202,0x55);
            auVar172 = vsubps_avx(auVar93,auVar178);
            auVar345._0_4_ = auVar172._0_4_ * auVar217._0_4_ + fVar205;
            auVar345._4_4_ = auVar172._4_4_ * auVar217._4_4_ + fVar206;
            auVar345._8_4_ = auVar172._8_4_ * auVar217._8_4_ + fVar205;
            auVar345._12_4_ = auVar172._12_4_ * auVar217._12_4_ + fVar206;
            auVar179._8_8_ = auVar138._0_8_;
            auVar179._0_8_ = auVar138._0_8_;
            auVar93 = vshufpd_avx(auVar138,auVar138,1);
            auVar93 = vsubps_avx(auVar93,auVar179);
            auVar139._0_4_ = auVar93._0_4_ * auVar217._0_4_ + fVar207;
            auVar139._4_4_ = auVar93._4_4_ * auVar217._4_4_ + fVar210;
            auVar139._8_4_ = auVar93._8_4_ * auVar217._8_4_ + fVar207;
            auVar139._12_4_ = auVar93._12_4_ * auVar217._12_4_ + fVar210;
            auVar217 = vmovshdup_avx(auVar139);
            auVar253._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
            auVar253._8_4_ = auVar217._8_4_ ^ 0x80000000;
            auVar253._12_4_ = auVar217._12_4_ ^ 0x80000000;
            auVar186 = vmovshdup_avx(auVar172);
            auVar93 = vunpcklps_avx(auVar186,auVar253);
            auVar146 = vshufps_avx(auVar93,auVar253,4);
            auVar98._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
            auVar98._8_4_ = -auVar172._8_4_;
            auVar98._12_4_ = -auVar172._12_4_;
            auVar93 = vmovlhps_avx(auVar98,auVar139);
            auVar134 = vshufps_avx(auVar93,auVar139,8);
            auVar93 = ZEXT416((uint)(auVar139._0_4_ * auVar186._0_4_ -
                                    auVar172._0_4_ * auVar217._0_4_));
            auVar217 = vshufps_avx(auVar93,auVar93,0);
            auVar93 = vdivps_avx(auVar146,auVar217);
            auVar217 = vdivps_avx(auVar134,auVar217);
            auVar134 = vinsertps_avx(auVar302,auVar358,0x1c);
            auVar172 = vinsertps_avx(auVar312,auVar362,0x1c);
            auVar135 = vinsertps_avx(auVar358,auVar302,0x4c);
            auVar273 = vinsertps_avx(auVar362,auVar312,0x4c);
            auVar186 = vmovsldup_avx(auVar93);
            auVar180._0_4_ = auVar186._0_4_ * auVar134._0_4_;
            auVar180._4_4_ = auVar186._4_4_ * auVar134._4_4_;
            auVar180._8_4_ = auVar186._8_4_ * auVar134._8_4_;
            auVar180._12_4_ = auVar186._12_4_ * auVar134._12_4_;
            auVar140._0_4_ = auVar172._0_4_ * auVar186._0_4_;
            auVar140._4_4_ = auVar172._4_4_ * auVar186._4_4_;
            auVar140._8_4_ = auVar172._8_4_ * auVar186._8_4_;
            auVar140._12_4_ = auVar172._12_4_ * auVar186._12_4_;
            auVar146 = vminps_avx(auVar180,auVar140);
            auVar186 = vmaxps_avx(auVar140,auVar180);
            auVar74 = vmovsldup_avx(auVar217);
            auVar363._0_4_ = auVar135._0_4_ * auVar74._0_4_;
            auVar363._4_4_ = auVar135._4_4_ * auVar74._4_4_;
            auVar363._8_4_ = auVar135._8_4_ * auVar74._8_4_;
            auVar363._12_4_ = auVar135._12_4_ * auVar74._12_4_;
            auVar181._0_4_ = auVar273._0_4_ * auVar74._0_4_;
            auVar181._4_4_ = auVar273._4_4_ * auVar74._4_4_;
            auVar181._8_4_ = auVar273._8_4_ * auVar74._8_4_;
            auVar181._12_4_ = auVar273._12_4_ * auVar74._12_4_;
            auVar74 = vminps_avx(auVar363,auVar181);
            auVar227._0_4_ = auVar146._0_4_ + auVar74._0_4_;
            auVar227._4_4_ = auVar146._4_4_ + auVar74._4_4_;
            auVar227._8_4_ = auVar146._8_4_ + auVar74._8_4_;
            auVar227._12_4_ = auVar146._12_4_ + auVar74._12_4_;
            auVar146 = vmaxps_avx(auVar181,auVar363);
            auVar74 = vsubps_avx(auVar327,auVar202);
            auVar76 = vsubps_avx(auVar334,auVar202);
            auVar141._0_4_ = auVar186._0_4_ + auVar146._0_4_;
            auVar141._4_4_ = auVar186._4_4_ + auVar146._4_4_;
            auVar141._8_4_ = auVar186._8_4_ + auVar146._8_4_;
            auVar141._12_4_ = auVar186._12_4_ + auVar146._12_4_;
            auVar182._8_8_ = 0x3f800000;
            auVar182._0_8_ = 0x3f800000;
            auVar186 = vsubps_avx(auVar182,auVar141);
            auVar146 = vsubps_avx(auVar182,auVar227);
            fVar241 = auVar74._0_4_;
            auVar228._0_4_ = fVar241 * auVar186._0_4_;
            fVar113 = auVar74._4_4_;
            auVar228._4_4_ = fVar113 * auVar186._4_4_;
            fVar115 = auVar74._8_4_;
            auVar228._8_4_ = fVar115 * auVar186._8_4_;
            fVar116 = auVar74._12_4_;
            auVar228._12_4_ = fVar116 * auVar186._12_4_;
            fVar207 = auVar76._0_4_;
            auVar142._0_4_ = fVar207 * auVar186._0_4_;
            fVar210 = auVar76._4_4_;
            auVar142._4_4_ = fVar210 * auVar186._4_4_;
            fVar235 = auVar76._8_4_;
            auVar142._8_4_ = fVar235 * auVar186._8_4_;
            fVar238 = auVar76._12_4_;
            auVar142._12_4_ = fVar238 * auVar186._12_4_;
            auVar335._0_4_ = fVar241 * auVar146._0_4_;
            auVar335._4_4_ = fVar113 * auVar146._4_4_;
            auVar335._8_4_ = fVar115 * auVar146._8_4_;
            auVar335._12_4_ = fVar116 * auVar146._12_4_;
            auVar183._0_4_ = fVar207 * auVar146._0_4_;
            auVar183._4_4_ = fVar210 * auVar146._4_4_;
            auVar183._8_4_ = fVar235 * auVar146._8_4_;
            auVar183._12_4_ = fVar238 * auVar146._12_4_;
            auVar186 = vminps_avx(auVar228,auVar335);
            auVar146 = vminps_avx(auVar142,auVar183);
            auVar74 = vminps_avx(auVar186,auVar146);
            auVar186 = vmaxps_avx(auVar335,auVar228);
            auVar146 = vmaxps_avx(auVar183,auVar142);
            auVar76 = vshufps_avx(auVar202,auVar202,0x54);
            auVar146 = vmaxps_avx(auVar146,auVar186);
            auVar121 = vshufps_avx(auVar345,auVar345,0);
            auVar122 = vshufps_avx(auVar345,auVar345,0x55);
            auVar186 = vhaddps_avx(auVar74,auVar74);
            auVar146 = vhaddps_avx(auVar146,auVar146);
            auVar203._0_4_ = auVar121._0_4_ * auVar93._0_4_ + auVar122._0_4_ * auVar217._0_4_;
            auVar203._4_4_ = auVar121._4_4_ * auVar93._4_4_ + auVar122._4_4_ * auVar217._4_4_;
            auVar203._8_4_ = auVar121._8_4_ * auVar93._8_4_ + auVar122._8_4_ * auVar217._8_4_;
            auVar203._12_4_ = auVar121._12_4_ * auVar93._12_4_ + auVar122._12_4_ * auVar217._12_4_;
            auVar74 = vsubps_avx(auVar76,auVar203);
            fVar205 = auVar74._0_4_ + auVar186._0_4_;
            fVar206 = auVar74._0_4_ + auVar146._0_4_;
            auVar186 = vmaxss_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar205));
            auVar146 = vminss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar154));
            if (auVar186._0_4_ <= auVar146._0_4_) {
              auVar186 = vmovshdup_avx(auVar93);
              auVar99._0_4_ = auVar186._0_4_ * auVar134._0_4_;
              auVar99._4_4_ = auVar186._4_4_ * auVar134._4_4_;
              auVar99._8_4_ = auVar186._8_4_ * auVar134._8_4_;
              auVar99._12_4_ = auVar186._12_4_ * auVar134._12_4_;
              auVar143._0_4_ = auVar172._0_4_ * auVar186._0_4_;
              auVar143._4_4_ = auVar172._4_4_ * auVar186._4_4_;
              auVar143._8_4_ = auVar172._8_4_ * auVar186._8_4_;
              auVar143._12_4_ = auVar172._12_4_ * auVar186._12_4_;
              auVar146 = vminps_avx(auVar99,auVar143);
              auVar186 = vmaxps_avx(auVar143,auVar99);
              auVar134 = vmovshdup_avx(auVar217);
              auVar229._0_4_ = auVar135._0_4_ * auVar134._0_4_;
              auVar229._4_4_ = auVar135._4_4_ * auVar134._4_4_;
              auVar229._8_4_ = auVar135._8_4_ * auVar134._8_4_;
              auVar229._12_4_ = auVar135._12_4_ * auVar134._12_4_;
              auVar144._0_4_ = auVar273._0_4_ * auVar134._0_4_;
              auVar144._4_4_ = auVar273._4_4_ * auVar134._4_4_;
              auVar144._8_4_ = auVar273._8_4_ * auVar134._8_4_;
              auVar144._12_4_ = auVar273._12_4_ * auVar134._12_4_;
              auVar134 = vminps_avx(auVar229,auVar144);
              auVar184._0_4_ = auVar146._0_4_ + auVar134._0_4_;
              auVar184._4_4_ = auVar146._4_4_ + auVar134._4_4_;
              auVar184._8_4_ = auVar146._8_4_ + auVar134._8_4_;
              auVar184._12_4_ = auVar146._12_4_ + auVar134._12_4_;
              auVar146 = vmaxps_avx(auVar144,auVar229);
              auVar100._0_4_ = auVar186._0_4_ + auVar146._0_4_;
              auVar100._4_4_ = auVar186._4_4_ + auVar146._4_4_;
              auVar100._8_4_ = auVar186._8_4_ + auVar146._8_4_;
              auVar100._12_4_ = auVar186._12_4_ + auVar146._12_4_;
              auVar186 = vsubps_avx(auVar268,auVar100);
              auVar146 = vsubps_avx(auVar268,auVar184);
              auVar185._0_4_ = fVar241 * auVar186._0_4_;
              auVar185._4_4_ = fVar113 * auVar186._4_4_;
              auVar185._8_4_ = fVar115 * auVar186._8_4_;
              auVar185._12_4_ = fVar116 * auVar186._12_4_;
              auVar230._0_4_ = fVar241 * auVar146._0_4_;
              auVar230._4_4_ = fVar113 * auVar146._4_4_;
              auVar230._8_4_ = fVar115 * auVar146._8_4_;
              auVar230._12_4_ = fVar116 * auVar146._12_4_;
              auVar101._0_4_ = fVar207 * auVar186._0_4_;
              auVar101._4_4_ = fVar210 * auVar186._4_4_;
              auVar101._8_4_ = fVar235 * auVar186._8_4_;
              auVar101._12_4_ = fVar238 * auVar186._12_4_;
              auVar145._0_4_ = fVar207 * auVar146._0_4_;
              auVar145._4_4_ = fVar210 * auVar146._4_4_;
              auVar145._8_4_ = fVar235 * auVar146._8_4_;
              auVar145._12_4_ = fVar238 * auVar146._12_4_;
              auVar186 = vminps_avx(auVar185,auVar230);
              auVar146 = vminps_avx(auVar101,auVar145);
              auVar186 = vminps_avx(auVar186,auVar146);
              auVar146 = vmaxps_avx(auVar230,auVar185);
              auVar134 = vmaxps_avx(auVar145,auVar101);
              auVar186 = vhaddps_avx(auVar186,auVar186);
              auVar146 = vmaxps_avx(auVar134,auVar146);
              auVar146 = vhaddps_avx(auVar146,auVar146);
              auVar134 = vmovshdup_avx(auVar74);
              auVar172 = ZEXT416((uint)(auVar134._0_4_ + auVar186._0_4_));
              auVar186 = vmaxss_avx(auVar270,auVar172);
              auVar134 = ZEXT416((uint)(auVar134._0_4_ + auVar146._0_4_));
              auVar146 = vminss_avx(auVar134,auVar75);
              if (auVar186._0_4_ <= auVar146._0_4_) {
                bVar70 = 0;
                if ((fVar190 < fVar205) && (fVar206 < fVar154)) {
                  auVar186 = vcmpps_avx(auVar134,auVar75,1);
                  auVar146 = vcmpps_avx(auVar270,auVar172,1);
                  auVar186 = vandps_avx(auVar146,auVar186);
                  bVar70 = auVar186[0];
                }
                auVar338 = ZEXT1664(auVar270);
                if ((uVar73 < 4 && 0.001 <= fVar155) && (bVar70 & 1) == 0) goto LAB_00f5c966;
                lVar68 = 200;
                do {
                  fVar155 = auVar74._0_4_;
                  fVar154 = 1.0 - fVar155;
                  auVar186 = ZEXT416((uint)(fVar154 * fVar154 * fVar154));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar146 = ZEXT416((uint)(fVar155 * 3.0 * fVar154 * fVar154));
                  auVar146 = vshufps_avx(auVar146,auVar146,0);
                  auVar134 = ZEXT416((uint)(fVar154 * fVar155 * fVar155 * 3.0));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  auVar172 = ZEXT416((uint)(fVar155 * fVar155 * fVar155));
                  auVar172 = vshufps_avx(auVar172,auVar172,0);
                  local_5f0._0_4_ = auVar17._0_4_;
                  local_5f0._4_4_ = auVar17._4_4_;
                  fStack_5e8 = auVar17._8_4_;
                  fStack_5e4 = auVar17._12_4_;
                  fVar154 = auVar186._0_4_ * (float)local_6d0._0_4_ +
                            auVar146._0_4_ * (float)local_6e0._0_4_ +
                            auVar172._0_4_ * (float)local_5f0._0_4_ + auVar134._0_4_ * local_5b0;
                  fVar155 = auVar186._4_4_ * (float)local_6d0._4_4_ +
                            auVar146._4_4_ * (float)local_6e0._4_4_ +
                            auVar172._4_4_ * (float)local_5f0._4_4_ + auVar134._4_4_ * fStack_5ac;
                  auVar102._0_8_ = CONCAT44(fVar155,fVar154);
                  auVar102._8_4_ =
                       auVar186._8_4_ * fStack_6c8 +
                       auVar146._8_4_ * fStack_6d8 +
                       auVar172._8_4_ * fStack_5e8 + auVar134._8_4_ * fStack_5a8;
                  auVar102._12_4_ =
                       auVar186._12_4_ * fStack_6c4 +
                       auVar146._12_4_ * fStack_6d4 +
                       auVar172._12_4_ * fStack_5e4 + auVar134._12_4_ * fStack_5a4;
                  auVar147._8_8_ = auVar102._0_8_;
                  auVar147._0_8_ = auVar102._0_8_;
                  auVar146 = vshufpd_avx(auVar102,auVar102,1);
                  auVar186 = vmovshdup_avx(auVar74);
                  auVar146 = vsubps_avx(auVar146,auVar147);
                  auVar103._0_4_ = auVar186._0_4_ * auVar146._0_4_ + fVar154;
                  auVar103._4_4_ = auVar186._4_4_ * auVar146._4_4_ + fVar155;
                  auVar103._8_4_ = auVar186._8_4_ * auVar146._8_4_ + fVar154;
                  auVar103._12_4_ = auVar186._12_4_ * auVar146._12_4_ + fVar155;
                  auVar186 = vshufps_avx(auVar103,auVar103,0);
                  auVar146 = vshufps_avx(auVar103,auVar103,0x55);
                  auVar148._0_4_ = auVar93._0_4_ * auVar186._0_4_ + auVar217._0_4_ * auVar146._0_4_;
                  auVar148._4_4_ = auVar93._4_4_ * auVar186._4_4_ + auVar217._4_4_ * auVar146._4_4_;
                  auVar148._8_4_ = auVar93._8_4_ * auVar186._8_4_ + auVar217._8_4_ * auVar146._8_4_;
                  auVar148._12_4_ =
                       auVar93._12_4_ * auVar186._12_4_ + auVar217._12_4_ * auVar146._12_4_;
                  auVar74 = vsubps_avx(auVar74,auVar148);
                  auVar149._8_4_ = 0x7fffffff;
                  auVar149._0_8_ = 0x7fffffff7fffffff;
                  auVar149._12_4_ = 0x7fffffff;
                  auVar186 = vandps_avx(auVar103,auVar149);
                  auVar146 = vshufps_avx(auVar186,auVar186,0xf5);
                  auVar186 = vmaxss_avx(auVar146,auVar186);
                  if (auVar186._0_4_ < fVar120) {
                    fVar154 = auVar74._0_4_;
                    if ((fVar154 < 0.0) || (1.0 < fVar154)) break;
                    auVar93 = vmovshdup_avx(auVar74);
                    fVar155 = auVar93._0_4_;
                    if ((fVar155 < 0.0) || (1.0 < fVar155)) break;
                    auVar93 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar273 = vinsertps_avx(auVar93,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar93 = vdpps_avx(auVar273,local_380,0x7f);
                    auVar217 = vdpps_avx(auVar273,local_390,0x7f);
                    auVar186 = vdpps_avx(auVar273,local_3a0,0x7f);
                    auVar146 = vdpps_avx(auVar273,local_3b0,0x7f);
                    auVar134 = vdpps_avx(auVar273,local_3c0,0x7f);
                    auVar172 = vdpps_avx(auVar273,local_3d0,0x7f);
                    auVar135 = vdpps_avx(auVar273,local_3e0,0x7f);
                    auVar273 = vdpps_avx(auVar273,local_3f0,0x7f);
                    fVar210 = 1.0 - fVar155;
                    fVar235 = 1.0 - fVar154;
                    fVar190 = auVar74._4_4_;
                    fVar205 = auVar74._8_4_;
                    fVar206 = auVar74._12_4_;
                    fVar207 = fVar235 * fVar154 * fVar154 * 3.0;
                    auVar284._0_4_ = fVar154 * fVar154 * fVar154;
                    auVar284._4_4_ = fVar190 * fVar190 * fVar190;
                    auVar284._8_4_ = fVar205 * fVar205 * fVar205;
                    auVar284._12_4_ = fVar206 * fVar206 * fVar206;
                    fVar205 = fVar235 * fVar235 * fVar154 * 3.0;
                    fVar206 = fVar235 * fVar235 * fVar235;
                    fVar190 = fVar206 * (fVar210 * auVar93._0_4_ + fVar155 * auVar134._0_4_) +
                              (fVar210 * auVar217._0_4_ + auVar172._0_4_ * fVar155) * fVar205 +
                              fVar207 * (auVar135._0_4_ * fVar155 + fVar210 * auVar186._0_4_) +
                              auVar284._0_4_ * (fVar210 * auVar146._0_4_ + fVar155 * auVar273._0_4_)
                    ;
                    if (((fVar190 < fVar119) ||
                        (fVar210 = *(float *)(ray + k * 4 + 0x100), fVar210 < fVar190)) ||
                       (pGVar9 = (context->scene->geometries).items[uVar66].ptr,
                       (pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar74,auVar74,0x55);
                    auVar313._8_4_ = 0x3f800000;
                    auVar313._0_8_ = 0x3f8000003f800000;
                    auVar313._12_4_ = 0x3f800000;
                    auVar93 = vsubps_avx(auVar313,auStack_f0);
                    fVar238 = auStack_f0._0_4_;
                    fVar241 = auStack_f0._4_4_;
                    fVar113 = auStack_f0._8_4_;
                    fVar115 = auStack_f0._12_4_;
                    fVar116 = auVar93._0_4_;
                    fVar117 = auVar93._4_4_;
                    fVar118 = auVar93._8_4_;
                    fVar209 = auVar93._12_4_;
                    auVar328._0_4_ =
                         fVar238 * (float)local_4a0._0_4_ + fVar116 * (float)local_480._0_4_;
                    auVar328._4_4_ =
                         fVar241 * (float)local_4a0._4_4_ + fVar117 * (float)local_480._4_4_;
                    auVar328._8_4_ = fVar113 * fStack_498 + fVar118 * fStack_478;
                    auVar328._12_4_ = fVar115 * fStack_494 + fVar209 * fStack_474;
                    auVar336._0_4_ = fVar238 * (float)local_4b0._0_4_ + fVar116 * fVar212;
                    auVar336._4_4_ = fVar241 * (float)local_4b0._4_4_ + fVar117 * fVar237;
                    auVar336._8_4_ = fVar113 * fStack_4a8 + fVar118 * fVar240;
                    auVar336._12_4_ = fVar115 * fStack_4a4 + fVar209 * fVar243;
                    auVar346._0_4_ = fVar238 * fVar257 + fVar116 * (float)local_490._0_4_;
                    auVar346._4_4_ = fVar241 * fVar208 + fVar117 * (float)local_490._4_4_;
                    auVar346._8_4_ = fVar113 * fVar239 + fVar118 * fStack_488;
                    auVar346._12_4_ = fVar115 * fVar114 + fVar209 * fStack_484;
                    auVar314._0_4_ = fVar238 * (float)local_410._0_4_ + fVar116 * fVar244;
                    auVar314._4_4_ = fVar241 * (float)local_410._4_4_ + fVar117 * fVar259;
                    auVar314._8_4_ = fVar113 * fStack_408 + fVar118 * fVar236;
                    auVar314._12_4_ = fVar115 * fStack_404 + fVar209 * fVar242;
                    auVar146 = vsubps_avx(auVar336,auVar328);
                    auVar134 = vsubps_avx(auVar346,auVar336);
                    auVar172 = vsubps_avx(auVar314,auVar346);
                    auStack_110 = vshufps_avx(auVar74,auVar74,0);
                    fVar115 = auStack_110._0_4_;
                    fVar116 = auStack_110._4_4_;
                    fVar117 = auStack_110._8_4_;
                    fVar118 = auStack_110._12_4_;
                    auVar93 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
                    fVar235 = auVar93._0_4_;
                    fVar238 = auVar93._4_4_;
                    fVar241 = auVar93._8_4_;
                    fVar113 = auVar93._12_4_;
                    auVar93 = vshufps_avx(auVar284,auVar284,0);
                    auVar217 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
                    auVar186 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                    auVar271._0_4_ =
                         (fVar235 * (fVar235 * auVar146._0_4_ + fVar115 * auVar134._0_4_) +
                         fVar115 * (fVar235 * auVar134._0_4_ + fVar115 * auVar172._0_4_)) * 3.0;
                    auVar271._4_4_ =
                         (fVar238 * (fVar238 * auVar146._4_4_ + fVar116 * auVar134._4_4_) +
                         fVar116 * (fVar238 * auVar134._4_4_ + fVar116 * auVar172._4_4_)) * 3.0;
                    auVar271._8_4_ =
                         (fVar241 * (fVar241 * auVar146._8_4_ + fVar117 * auVar134._8_4_) +
                         fVar117 * (fVar241 * auVar134._8_4_ + fVar117 * auVar172._8_4_)) * 3.0;
                    auVar271._12_4_ =
                         (fVar113 * (fVar113 * auVar146._12_4_ + fVar118 * auVar134._12_4_) +
                         fVar118 * (fVar113 * auVar134._12_4_ + fVar118 * auVar172._12_4_)) * 3.0;
                    auVar146 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
                    auVar231._0_4_ =
                         auVar146._0_4_ * (float)local_420._0_4_ +
                         auVar186._0_4_ * (float)local_430._0_4_ +
                         auVar93._0_4_ * (float)local_450._0_4_ +
                         auVar217._0_4_ * (float)local_440._0_4_;
                    auVar231._4_4_ =
                         auVar146._4_4_ * (float)local_420._4_4_ +
                         auVar186._4_4_ * (float)local_430._4_4_ +
                         auVar93._4_4_ * (float)local_450._4_4_ +
                         auVar217._4_4_ * (float)local_440._4_4_;
                    auVar231._8_4_ =
                         auVar146._8_4_ * fStack_418 +
                         auVar186._8_4_ * fStack_428 +
                         auVar93._8_4_ * fStack_448 + auVar217._8_4_ * fStack_438;
                    auVar231._12_4_ =
                         auVar146._12_4_ * fStack_414 +
                         auVar186._12_4_ * fStack_424 +
                         auVar93._12_4_ * fStack_444 + auVar217._12_4_ * fStack_434;
                    auVar93 = vshufps_avx(auVar271,auVar271,0xc9);
                    auVar254._0_4_ = auVar231._0_4_ * auVar93._0_4_;
                    auVar254._4_4_ = auVar231._4_4_ * auVar93._4_4_;
                    auVar254._8_4_ = auVar231._8_4_ * auVar93._8_4_;
                    auVar254._12_4_ = auVar231._12_4_ * auVar93._12_4_;
                    auVar93 = vshufps_avx(auVar231,auVar231,0xc9);
                    auVar232._0_4_ = auVar271._0_4_ * auVar93._0_4_;
                    auVar232._4_4_ = auVar271._4_4_ * auVar93._4_4_;
                    auVar232._8_4_ = auVar271._8_4_ * auVar93._8_4_;
                    auVar232._12_4_ = auVar271._12_4_ * auVar93._12_4_;
                    auVar93 = vsubps_avx(auVar232,auVar254);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar190;
                      uVar5 = vextractps_avx(auVar93,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar5;
                      uVar5 = vextractps_avx(auVar93,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar93._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar154;
                      *(float *)(ray + k * 4 + 0x200) = fVar155;
                      *(uint *)(ray + k * 4 + 0x220) = uVar8;
                      *(uint *)(ray + k * 4 + 0x240) = uVar66;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar93,auVar93,0x55);
                    auStack_150 = vshufps_avx(auVar93,auVar93,0xaa);
                    auStack_130 = vshufps_avx(auVar93,auVar93,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_2e0._0_8_;
                    uStack_d8 = local_2e0._8_8_;
                    uStack_d0 = local_2e0._16_8_;
                    uStack_c8 = local_2e0._24_8_;
                    local_c0 = local_2c0._0_8_;
                    uStack_b8 = local_2c0._8_8_;
                    uStack_b0 = local_2c0._16_8_;
                    uStack_a8 = local_2c0._24_8_;
                    auVar105 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar105._28_4_;
                    uVar71 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar190;
                    local_500 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar65 & 0xf) << 4));
                    local_4f0 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar65 >> 4) * 0x10);
                    local_4e0.valid = (int *)local_500;
                    local_4e0.geometryUserPtr = pGVar9->userPtr;
                    local_4e0.context = context->user;
                    local_4e0.hit = local_180;
                    local_4e0.N = 8;
                    local_4e0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->intersectionFilterN)(&local_4e0);
                    }
                    auVar93 = vpcmpeqd_avx(local_500,ZEXT816(0) << 0x40);
                    auVar217 = vpcmpeqd_avx(local_4f0,ZEXT816(0) << 0x40);
                    auVar189._16_16_ = auVar217;
                    auVar189._0_16_ = auVar93;
                    auVar20 = auVar105 & ~auVar189;
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0xbf,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar20[0x1f] < '\0') {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&local_4e0);
                      }
                      auVar93 = vpcmpeqd_avx(local_500,ZEXT816(0) << 0x40);
                      auVar217 = vpcmpeqd_avx(local_4f0,ZEXT816(0) << 0x40);
                      auVar111._16_16_ = auVar217;
                      auVar111._0_16_ = auVar93;
                      auVar20 = auVar105 & ~auVar111;
                      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar20 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar20 >> 0x7f,0) != '\0') ||
                            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0xbf,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar20[0x1f] < '\0') {
                        auVar112._0_4_ = auVar93._0_4_ ^ auVar105._0_4_;
                        auVar112._4_4_ = auVar93._4_4_ ^ auVar105._4_4_;
                        auVar112._8_4_ = auVar93._8_4_ ^ auVar105._8_4_;
                        auVar112._12_4_ = auVar93._12_4_ ^ auVar105._12_4_;
                        auVar112._16_4_ = auVar217._0_4_ ^ auVar105._16_4_;
                        auVar112._20_4_ = auVar217._4_4_ ^ auVar105._20_4_;
                        auVar112._24_4_ = auVar217._8_4_ ^ auVar105._24_4_;
                        auVar112._28_4_ = auVar217._12_4_ ^ uVar71;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])local_4e0.hit);
                        *(undefined1 (*) [32])(local_4e0.ray + 0x180) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0x20));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x1a0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0x40));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x1c0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0x60));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x1e0) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0x80));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x200) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x220) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x240) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x260) = auVar105;
                        auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])
                                                            (local_4e0.hit + 0x100));
                        *(undefined1 (*) [32])(local_4e0.ray + 0x280) = auVar105;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar210;
                    break;
                  }
                  lVar68 = lVar68 + -1;
                } while (lVar68 != 0);
              }
            }
          }
        }
        if (uVar73 == 0) break;
      } while( true );
    }
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar104._4_4_ = uVar5;
    auVar104._0_4_ = uVar5;
    auVar104._8_4_ = uVar5;
    auVar104._12_4_ = uVar5;
    auVar93 = vcmpps_avx(local_460,auVar104,2);
    uVar66 = vmovmskps_avx(auVar93);
    uVar64 = uVar64 & uVar64 + 0xf & uVar66;
    auVar55 = ZEXT812(0) << 0x20;
    if (uVar64 == 0) {
      return;
    }
  } while( true );
LAB_00f5c966:
  auVar93 = vinsertps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar154),0x10);
  auVar367 = ZEXT1664(auVar93);
  goto LAB_00f5b18c;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }